

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  int iVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  byte bVar86;
  byte bVar87;
  ulong uVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar92;
  Geometry *pGVar93;
  uint uVar94;
  ulong uVar95;
  long lVar96;
  byte bVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar150;
  float fVar151;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar103 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar104 [16];
  float fVar152;
  float fVar154;
  float fVar155;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar153;
  float fVar156;
  float fVar157;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  float fVar158;
  undefined4 uVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined8 uVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar189;
  undefined1 auVar188 [64];
  float fVar190;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_690;
  undefined8 uStack_688;
  Precalculations *local_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  RTCFilterFunctionNArguments local_650;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  Geometry *local_608;
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined8 uStack_518;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  LinearSpace3fa *local_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_450 [16];
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  float local_420;
  undefined1 auStack_41c [8];
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  byte local_350;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  int local_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_270 [16];
  uint local_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar11 = prim[1];
  uVar91 = (ulong)(byte)PVar11;
  fVar190 = *(float *)(prim + uVar91 * 0x19 + 0x12);
  auVar23 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar24 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar103 = vsubps_avx(auVar23,*(undefined1 (*) [16])(prim + uVar91 * 0x19 + 6));
  fVar174 = fVar190 * auVar103._0_4_;
  fVar158 = fVar190 * auVar24._0_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar91 * 4 + 6);
  auVar112 = vpmovsxbd_avx2(auVar23);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar91 * 5 + 6);
  auVar110 = vpmovsxbd_avx2(auVar102);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar91 * 6 + 6);
  auVar125 = vpmovsxbd_avx2(auVar101);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar126 = vpmovsxbd_avx2(auVar161);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar123 = vpmovsxbd_avx2(auVar160);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar124 = vcvtdq2ps_avx(auVar123);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar91 + 6);
  auVar111 = vpmovsxbd_avx2(auVar100);
  auVar111 = vcvtdq2ps_avx(auVar111);
  uVar95 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar95 + 6);
  auVar113 = vpmovsxbd_avx2(auVar8);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar95 + uVar91 + 6);
  auVar114 = vpmovsxbd_avx2(auVar9);
  auVar114 = vcvtdq2ps_avx(auVar114);
  uVar88 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar109 = vpmovsxbd_avx2(auVar10);
  auVar115 = vcvtdq2ps_avx(auVar109);
  auVar214._4_4_ = fVar158;
  auVar214._0_4_ = fVar158;
  auVar214._8_4_ = fVar158;
  auVar214._12_4_ = fVar158;
  auVar214._16_4_ = fVar158;
  auVar214._20_4_ = fVar158;
  auVar214._24_4_ = fVar158;
  auVar214._28_4_ = fVar158;
  auVar216._8_4_ = 1;
  auVar216._0_8_ = 0x100000001;
  auVar216._12_4_ = 1;
  auVar216._16_4_ = 1;
  auVar216._20_4_ = 1;
  auVar216._24_4_ = 1;
  auVar216._28_4_ = 1;
  auVar107 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar117 = ZEXT1632(CONCAT412(fVar190 * auVar24._12_4_,
                                CONCAT48(fVar190 * auVar24._8_4_,
                                         CONCAT44(fVar190 * auVar24._4_4_,fVar158))));
  auVar116 = vpermps_avx2(auVar216,auVar117);
  auVar108 = vpermps_avx512vl(auVar107,auVar117);
  fVar158 = auVar108._0_4_;
  fVar196 = auVar108._4_4_;
  auVar117._4_4_ = fVar196 * auVar125._4_4_;
  auVar117._0_4_ = fVar158 * auVar125._0_4_;
  fVar197 = auVar108._8_4_;
  auVar117._8_4_ = fVar197 * auVar125._8_4_;
  fVar175 = auVar108._12_4_;
  auVar117._12_4_ = fVar175 * auVar125._12_4_;
  fVar189 = auVar108._16_4_;
  auVar117._16_4_ = fVar189 * auVar125._16_4_;
  fVar98 = auVar108._20_4_;
  auVar117._20_4_ = fVar98 * auVar125._20_4_;
  fVar99 = auVar108._24_4_;
  auVar117._24_4_ = fVar99 * auVar125._24_4_;
  auVar117._28_4_ = auVar123._28_4_;
  auVar123._4_4_ = auVar111._4_4_ * fVar196;
  auVar123._0_4_ = auVar111._0_4_ * fVar158;
  auVar123._8_4_ = auVar111._8_4_ * fVar197;
  auVar123._12_4_ = auVar111._12_4_ * fVar175;
  auVar123._16_4_ = auVar111._16_4_ * fVar189;
  auVar123._20_4_ = auVar111._20_4_ * fVar98;
  auVar123._24_4_ = auVar111._24_4_ * fVar99;
  auVar123._28_4_ = auVar109._28_4_;
  auVar109._4_4_ = auVar115._4_4_ * fVar196;
  auVar109._0_4_ = auVar115._0_4_ * fVar158;
  auVar109._8_4_ = auVar115._8_4_ * fVar197;
  auVar109._12_4_ = auVar115._12_4_ * fVar175;
  auVar109._16_4_ = auVar115._16_4_ * fVar189;
  auVar109._20_4_ = auVar115._20_4_ * fVar98;
  auVar109._24_4_ = auVar115._24_4_ * fVar99;
  auVar109._28_4_ = auVar108._28_4_;
  auVar23 = vfmadd231ps_fma(auVar117,auVar116,auVar110);
  auVar102 = vfmadd231ps_fma(auVar123,auVar116,auVar124);
  auVar101 = vfmadd231ps_fma(auVar109,auVar114,auVar116);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar214,auVar112);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar214,auVar126);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar113,auVar214);
  auVar215._4_4_ = fVar174;
  auVar215._0_4_ = fVar174;
  auVar215._8_4_ = fVar174;
  auVar215._12_4_ = fVar174;
  auVar215._16_4_ = fVar174;
  auVar215._20_4_ = fVar174;
  auVar215._24_4_ = fVar174;
  auVar215._28_4_ = fVar174;
  auVar109 = ZEXT1632(CONCAT412(fVar190 * auVar103._12_4_,
                                CONCAT48(fVar190 * auVar103._8_4_,
                                         CONCAT44(fVar190 * auVar103._4_4_,fVar174))));
  auVar123 = vpermps_avx2(auVar216,auVar109);
  auVar109 = vpermps_avx512vl(auVar107,auVar109);
  fVar190 = auVar109._0_4_;
  fVar158 = auVar109._4_4_;
  auVar116._4_4_ = fVar158 * auVar125._4_4_;
  auVar116._0_4_ = fVar190 * auVar125._0_4_;
  fVar196 = auVar109._8_4_;
  auVar116._8_4_ = fVar196 * auVar125._8_4_;
  fVar197 = auVar109._12_4_;
  auVar116._12_4_ = fVar197 * auVar125._12_4_;
  fVar175 = auVar109._16_4_;
  auVar116._16_4_ = fVar175 * auVar125._16_4_;
  fVar189 = auVar109._20_4_;
  auVar116._20_4_ = fVar189 * auVar125._20_4_;
  fVar98 = auVar109._24_4_;
  auVar116._24_4_ = fVar98 * auVar125._24_4_;
  auVar116._28_4_ = 1;
  auVar107._4_4_ = auVar111._4_4_ * fVar158;
  auVar107._0_4_ = auVar111._0_4_ * fVar190;
  auVar107._8_4_ = auVar111._8_4_ * fVar196;
  auVar107._12_4_ = auVar111._12_4_ * fVar197;
  auVar107._16_4_ = auVar111._16_4_ * fVar175;
  auVar107._20_4_ = auVar111._20_4_ * fVar189;
  auVar107._24_4_ = auVar111._24_4_ * fVar98;
  auVar107._28_4_ = auVar125._28_4_;
  auVar111._4_4_ = auVar115._4_4_ * fVar158;
  auVar111._0_4_ = auVar115._0_4_ * fVar190;
  auVar111._8_4_ = auVar115._8_4_ * fVar196;
  auVar111._12_4_ = auVar115._12_4_ * fVar197;
  auVar111._16_4_ = auVar115._16_4_ * fVar175;
  auVar111._20_4_ = auVar115._20_4_ * fVar189;
  auVar111._24_4_ = auVar115._24_4_ * fVar98;
  auVar111._28_4_ = auVar109._28_4_;
  auVar161 = vfmadd231ps_fma(auVar116,auVar123,auVar110);
  auVar160 = vfmadd231ps_fma(auVar107,auVar123,auVar124);
  auVar100 = vfmadd231ps_fma(auVar111,auVar123,auVar114);
  auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar215,auVar112);
  auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar215,auVar126);
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar207._16_4_ = 0x7fffffff;
  auVar207._20_4_ = 0x7fffffff;
  auVar207._24_4_ = 0x7fffffff;
  auVar207._28_4_ = 0x7fffffff;
  auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar215,auVar113);
  auVar112 = vandps_avx(ZEXT1632(auVar23),auVar207);
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  uVar95 = vcmpps_avx512vl(auVar112,auVar122,1);
  bVar16 = (bool)((byte)uVar95 & 1);
  auVar108._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._0_4_;
  bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar108._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._4_4_;
  bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar108._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._8_4_;
  bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar108._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._12_4_;
  auVar108._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar108._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar108._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar108._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar102),auVar207);
  uVar95 = vcmpps_avx512vl(auVar112,auVar122,1);
  bVar16 = (bool)((byte)uVar95 & 1);
  auVar118._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._0_4_;
  bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar118._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._4_4_;
  bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar118._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._8_4_;
  bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar118._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar102._12_4_;
  auVar118._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar118._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar118._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar118._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar101),auVar207);
  uVar95 = vcmpps_avx512vl(auVar112,auVar122,1);
  bVar16 = (bool)((byte)uVar95 & 1);
  auVar112._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar101._0_4_;
  bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar101._4_4_;
  bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar101._8_4_;
  bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar101._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar110 = vrcp14ps_avx512vl(auVar108);
  auVar204._8_4_ = 0x3f800000;
  auVar204._0_8_ = &DAT_3f8000003f800000;
  auVar204._12_4_ = 0x3f800000;
  auVar204._16_4_ = 0x3f800000;
  auVar204._20_4_ = 0x3f800000;
  auVar204._24_4_ = 0x3f800000;
  auVar204._28_4_ = 0x3f800000;
  auVar23 = vfnmadd213ps_fma(auVar108,auVar110,auVar204);
  auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar118);
  auVar102 = vfnmadd213ps_fma(auVar118,auVar110,auVar204);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar112);
  auVar101 = vfnmadd213ps_fma(auVar112,auVar110,auVar204);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar110,auVar110);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 7 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar161));
  auVar113._4_4_ = auVar23._4_4_ * auVar112._4_4_;
  auVar113._0_4_ = auVar23._0_4_ * auVar112._0_4_;
  auVar113._8_4_ = auVar23._8_4_ * auVar112._8_4_;
  auVar113._12_4_ = auVar23._12_4_ * auVar112._12_4_;
  auVar113._16_4_ = auVar112._16_4_ * 0.0;
  auVar113._20_4_ = auVar112._20_4_ * 0.0;
  auVar113._24_4_ = auVar112._24_4_ * 0.0;
  auVar113._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 9 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar161));
  auVar111 = vpbroadcastd_avx512vl();
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar121._0_4_ = auVar23._0_4_ * auVar112._0_4_;
  auVar121._4_4_ = auVar23._4_4_ * auVar112._4_4_;
  auVar121._8_4_ = auVar23._8_4_ * auVar112._8_4_;
  auVar121._12_4_ = auVar23._12_4_ * auVar112._12_4_;
  auVar121._16_4_ = auVar112._16_4_ * 0.0;
  auVar121._20_4_ = auVar112._20_4_ * 0.0;
  auVar121._24_4_ = auVar112._24_4_ * 0.0;
  auVar121._28_4_ = 0;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar91 * -2 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar160));
  auVar114._4_4_ = auVar102._4_4_ * auVar112._4_4_;
  auVar114._0_4_ = auVar102._0_4_ * auVar112._0_4_;
  auVar114._8_4_ = auVar102._8_4_ * auVar112._8_4_;
  auVar114._12_4_ = auVar102._12_4_ * auVar112._12_4_;
  auVar114._16_4_ = auVar112._16_4_ * 0.0;
  auVar114._20_4_ = auVar112._20_4_ * 0.0;
  auVar114._24_4_ = auVar112._24_4_ * 0.0;
  auVar114._28_4_ = auVar112._28_4_;
  auVar205 = ZEXT3264(auVar114);
  auVar112 = vcvtdq2ps_avx(auVar110);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar160));
  auVar120._0_4_ = auVar102._0_4_ * auVar112._0_4_;
  auVar120._4_4_ = auVar102._4_4_ * auVar112._4_4_;
  auVar120._8_4_ = auVar102._8_4_ * auVar112._8_4_;
  auVar120._12_4_ = auVar102._12_4_ * auVar112._12_4_;
  auVar120._16_4_ = auVar112._16_4_ * 0.0;
  auVar120._20_4_ = auVar112._20_4_ * 0.0;
  auVar120._24_4_ = auVar112._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 + uVar91 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar100));
  auVar115._4_4_ = auVar112._4_4_ * auVar101._4_4_;
  auVar115._0_4_ = auVar112._0_4_ * auVar101._0_4_;
  auVar115._8_4_ = auVar112._8_4_ * auVar101._8_4_;
  auVar115._12_4_ = auVar112._12_4_ * auVar101._12_4_;
  auVar115._16_4_ = auVar112._16_4_ * 0.0;
  auVar115._20_4_ = auVar112._20_4_ * 0.0;
  auVar115._24_4_ = auVar112._24_4_ * 0.0;
  auVar115._28_4_ = auVar112._28_4_;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar91 * 0x17 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,ZEXT1632(auVar100));
  auVar119._0_4_ = auVar101._0_4_ * auVar112._0_4_;
  auVar119._4_4_ = auVar101._4_4_ * auVar112._4_4_;
  auVar119._8_4_ = auVar101._8_4_ * auVar112._8_4_;
  auVar119._12_4_ = auVar101._12_4_ * auVar112._12_4_;
  auVar119._16_4_ = auVar112._16_4_ * 0.0;
  auVar119._20_4_ = auVar112._20_4_ * 0.0;
  auVar119._24_4_ = auVar112._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar112 = vpminsd_avx2(auVar113,auVar121);
  auVar110 = vpminsd_avx2(auVar114,auVar120);
  auVar112 = vmaxps_avx(auVar112,auVar110);
  auVar110 = vpminsd_avx2(auVar115,auVar119);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar125._4_4_ = uVar159;
  auVar125._0_4_ = uVar159;
  auVar125._8_4_ = uVar159;
  auVar125._12_4_ = uVar159;
  auVar125._16_4_ = uVar159;
  auVar125._20_4_ = uVar159;
  auVar125._24_4_ = uVar159;
  auVar125._28_4_ = uVar159;
  auVar110 = vmaxps_avx512vl(auVar110,auVar125);
  auVar112 = vmaxps_avx(auVar112,auVar110);
  auVar110._8_4_ = 0x3f7ffffa;
  auVar110._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar110._12_4_ = 0x3f7ffffa;
  auVar110._16_4_ = 0x3f7ffffa;
  auVar110._20_4_ = 0x3f7ffffa;
  auVar110._24_4_ = 0x3f7ffffa;
  auVar110._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar112,auVar110);
  auVar188 = ZEXT3264(local_80);
  auVar112 = vpmaxsd_avx2(auVar113,auVar121);
  auVar110 = vpmaxsd_avx2(auVar114,auVar120);
  auVar112 = vminps_avx(auVar112,auVar110);
  auVar110 = vpmaxsd_avx2(auVar115,auVar119);
  uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar126._4_4_ = uVar159;
  auVar126._0_4_ = uVar159;
  auVar126._8_4_ = uVar159;
  auVar126._12_4_ = uVar159;
  auVar126._16_4_ = uVar159;
  auVar126._20_4_ = uVar159;
  auVar126._24_4_ = uVar159;
  auVar126._28_4_ = uVar159;
  auVar110 = vminps_avx512vl(auVar110,auVar126);
  auVar112 = vminps_avx(auVar112,auVar110);
  auVar124._8_4_ = 0x3f800003;
  auVar124._0_8_ = 0x3f8000033f800003;
  auVar124._12_4_ = 0x3f800003;
  auVar124._16_4_ = 0x3f800003;
  auVar124._20_4_ = 0x3f800003;
  auVar124._24_4_ = 0x3f800003;
  auVar124._28_4_ = 0x3f800003;
  auVar112 = vmulps_avx512vl(auVar112,auVar124);
  uVar25 = vpcmpgtd_avx512vl(auVar111,_DAT_0205a920);
  uVar171 = vcmpps_avx512vl(local_80,auVar112,2);
  if ((byte)((byte)uVar171 & (byte)uVar25) != 0) {
    uVar95 = (ulong)(byte)((byte)uVar171 & (byte)uVar25);
    local_4e8 = pre->ray_space + k;
    local_450 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_678 = pre;
    do {
      auVar110 = auVar205._0_32_;
      auVar112 = auVar188._0_32_;
      local_580 = in_ZMM21._0_32_;
      local_560 = in_ZMM20._0_32_;
      lVar26 = 0;
      for (uVar88 = uVar95; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar94 = *(uint *)(prim + 2);
      uVar12 = *(uint *)(prim + lVar26 * 4 + 6);
      pGVar93 = (context->scene->geometries).items[uVar94].ptr;
      uVar88 = (ulong)*(uint *)(*(long *)&pGVar93->field_0x58 +
                               pGVar93[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar12);
      p_Var15 = pGVar93[1].intersectionFilterN;
      lVar26 = *(long *)&pGVar93[1].time_range.upper;
      auVar23 = *(undefined1 (*) [16])(lVar26 + (long)p_Var15 * uVar88);
      pauVar3 = (undefined1 (*) [16])(lVar26 + (uVar88 + 1) * (long)p_Var15);
      local_660 = *(undefined8 *)*pauVar3;
      uStack_658 = *(undefined8 *)(*pauVar3 + 8);
      auVar102 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar26 + (uVar88 + 2) * (long)p_Var15);
      local_670 = *(undefined8 *)*pauVar4;
      uStack_668 = *(undefined8 *)(*pauVar4 + 8);
      auVar101 = *pauVar4;
      uVar95 = uVar95 - 1 & uVar95;
      pauVar5 = (undefined1 (*) [12])(lVar26 + (uVar88 + 3) * (long)p_Var15);
      local_360 = *(undefined8 *)*pauVar5;
      uStack_358 = *(undefined8 *)(*pauVar5 + 8);
      local_620 = (float)local_360;
      fStack_61c = (float)((ulong)local_360 >> 0x20);
      fStack_618 = (float)uStack_358;
      fStack_614 = (float)((ulong)uStack_358 >> 0x20);
      if (uVar95 != 0) {
        uVar91 = uVar95 - 1 & uVar95;
        for (uVar88 = uVar95; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
        }
        if (uVar91 != 0) {
          for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar93[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar161 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar100 = vsubps_avx(auVar23,auVar161);
      uVar159 = auVar100._0_4_;
      auVar103._4_4_ = uVar159;
      auVar103._0_4_ = uVar159;
      auVar103._8_4_ = uVar159;
      auVar103._12_4_ = uVar159;
      auVar160 = vshufps_avx(auVar100,auVar100,0x55);
      auVar100 = vshufps_avx(auVar100,auVar100,0xaa);
      aVar6 = (local_4e8->vx).field_0;
      aVar7 = (local_4e8->vy).field_0;
      fVar190 = (local_4e8->vz).field_0.m128[0];
      fVar158 = *(float *)((long)&(local_4e8->vz).field_0 + 4);
      fVar196 = *(float *)((long)&(local_4e8->vz).field_0 + 8);
      fVar197 = *(float *)((long)&(local_4e8->vz).field_0 + 0xc);
      auVar104._0_4_ = fVar190 * auVar100._0_4_;
      auVar104._4_4_ = fVar158 * auVar100._4_4_;
      auVar104._8_4_ = fVar196 * auVar100._8_4_;
      auVar104._12_4_ = fVar197 * auVar100._12_4_;
      auVar160 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar7,auVar160);
      auVar9 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar6,auVar103);
      auVar160 = vshufps_avx(auVar23,auVar23,0xff);
      auVar8 = vsubps_avx(auVar102,auVar161);
      uVar159 = auVar8._0_4_;
      auVar176._4_4_ = uVar159;
      auVar176._0_4_ = uVar159;
      auVar176._8_4_ = uVar159;
      auVar176._12_4_ = uVar159;
      auVar100 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      auVar209._0_4_ = fVar190 * auVar8._0_4_;
      auVar209._4_4_ = fVar158 * auVar8._4_4_;
      auVar209._8_4_ = fVar196 * auVar8._8_4_;
      auVar209._12_4_ = fVar197 * auVar8._12_4_;
      auVar100 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar7,auVar100);
      auVar10 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar6,auVar176);
      auVar102 = vshufps_avx(auVar102,auVar102,0xff);
      auVar8 = vsubps_avx(auVar101,auVar161);
      uVar159 = auVar8._0_4_;
      auVar206._4_4_ = uVar159;
      auVar206._0_4_ = uVar159;
      auVar206._8_4_ = uVar159;
      auVar206._12_4_ = uVar159;
      auVar100 = vshufps_avx(auVar8,auVar8,0x55);
      auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
      auVar211._0_4_ = fVar190 * auVar8._0_4_;
      auVar211._4_4_ = fVar158 * auVar8._4_4_;
      auVar211._8_4_ = fVar196 * auVar8._8_4_;
      auVar211._12_4_ = fVar197 * auVar8._12_4_;
      auVar100 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar7,auVar100);
      auVar8 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar6,auVar206);
      auVar101 = vshufps_avx(auVar101,auVar101,0xff);
      auVar24._12_4_ = fStack_614;
      auVar24._0_12_ = *pauVar5;
      auVar100 = vsubps_avx512vl(auVar24,auVar161);
      uVar159 = auVar100._0_4_;
      auVar177._4_4_ = uVar159;
      auVar177._0_4_ = uVar159;
      auVar177._8_4_ = uVar159;
      auVar177._12_4_ = uVar159;
      auVar161 = vshufps_avx(auVar100,auVar100,0x55);
      auVar100 = vshufps_avx(auVar100,auVar100,0xaa);
      auVar212._0_4_ = fVar190 * auVar100._0_4_;
      auVar212._4_4_ = fVar158 * auVar100._4_4_;
      auVar212._8_4_ = fVar196 * auVar100._8_4_;
      auVar212._12_4_ = fVar197 * auVar100._12_4_;
      auVar161 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar7,auVar161);
      auVar161 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar6,auVar177);
      lVar26 = (long)iVar13 * 0x44;
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26);
      auVar100 = vshufps_avx512vl(auVar24,auVar24,0xff);
      local_4a0 = vbroadcastss_avx512vl(auVar9);
      auVar191._8_4_ = 1;
      auVar191._0_8_ = 0x100000001;
      auVar191._12_4_ = 1;
      auVar191._16_4_ = 1;
      auVar191._20_4_ = 1;
      auVar191._24_4_ = 1;
      auVar191._28_4_ = 1;
      local_4c0 = vpermps_avx512vl(auVar191,ZEXT1632(auVar9));
      uVar171 = auVar160._0_8_;
      local_a0._8_8_ = uVar171;
      local_a0._0_8_ = uVar171;
      local_a0._16_8_ = uVar171;
      local_a0._24_8_ = uVar171;
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x484);
      uVar159 = auVar10._0_4_;
      local_600._4_4_ = uVar159;
      local_600._0_4_ = uVar159;
      local_600._8_4_ = uVar159;
      local_600._12_4_ = uVar159;
      local_600._16_4_ = uVar159;
      local_600._20_4_ = uVar159;
      local_600._24_4_ = uVar159;
      local_600._28_4_ = uVar159;
      local_1e0 = vpermps_avx512vl(auVar191,ZEXT1632(auVar10));
      uVar171 = auVar102._0_8_;
      local_c0._8_8_ = uVar171;
      local_c0._0_8_ = uVar171;
      local_c0._16_8_ = uVar171;
      local_c0._24_8_ = uVar171;
      auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x908);
      local_e0 = vbroadcastss_avx512vl(auVar8);
      local_100 = vpermps_avx512vl(auVar191,ZEXT1632(auVar8));
      local_120 = vbroadcastsd_avx512vl(auVar101);
      auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0xd8c);
      local_5a0 = vbroadcastss_avx512vl(auVar161);
      auVar224 = ZEXT3264(local_5a0);
      local_5c0 = vpermps_avx512vl(auVar191,ZEXT1632(auVar161));
      auVar225 = ZEXT3264(local_5c0);
      _local_140 = vbroadcastsd_avx512vl(auVar100);
      auVar113 = vmulps_avx512vl(local_5a0,auVar111);
      auVar114 = vmulps_avx512vl(local_5c0,auVar111);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar124,local_e0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar124,local_100);
      auVar102 = vfmadd231ps_fma(auVar113,auVar126,local_600);
      auVar115 = vfmadd231ps_avx512vl(auVar114,auVar126,local_1e0);
      auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar125,local_4a0);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26);
      auVar114 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x484);
      auVar116 = vfmadd231ps_avx512vl(auVar115,auVar125,local_4c0);
      auVar115 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x908);
      auVar123 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0xd8c);
      auVar117 = vmulps_avx512vl(local_5a0,auVar123);
      auVar107 = vmulps_avx512vl(local_5c0,auVar123);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,local_e0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar115,local_100);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,local_600);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar114,local_1e0);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,local_4a0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,local_4c0);
      auVar108 = vsubps_avx512vl(auVar117,auVar109);
      auVar118 = vsubps_avx512vl(auVar107,auVar116);
      auVar119 = vmulps_avx512vl(auVar116,auVar108);
      auVar120 = vmulps_avx512vl(auVar109,auVar118);
      auVar119 = vsubps_avx512vl(auVar119,auVar120);
      auVar120 = vmulps_avx512vl(_local_140,auVar111);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar124,local_120);
      auVar102 = vfmadd231ps_fma(auVar120,auVar126,local_c0);
      auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar125,local_a0);
      auVar121 = vmulps_avx512vl(_local_140,auVar123);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar115,local_120);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar114,local_c0);
      auVar160 = vfmadd231ps_fma(auVar121,auVar113,local_a0);
      auVar121 = vmulps_avx512vl(auVar118,auVar118);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar108,auVar108);
      auVar122 = vmaxps_avx512vl(auVar120,ZEXT1632(auVar160));
      auVar122 = vmulps_avx512vl(auVar122,auVar122);
      auVar121 = vmulps_avx512vl(auVar122,auVar121);
      auVar119 = vmulps_avx512vl(auVar119,auVar119);
      uVar171 = vcmpps_avx512vl(auVar119,auVar121,2);
      auVar102 = vblendps_avx(auVar9,auVar23,8);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar101 = vandps_avx512vl(auVar102,auVar100);
      auVar102 = vblendps_avx(auVar10,*pauVar3,8);
      auVar102 = vandps_avx512vl(auVar102,auVar100);
      auVar101 = vmaxps_avx(auVar101,auVar102);
      auVar102 = vblendps_avx(auVar8,*pauVar4,8);
      auVar103 = vandps_avx512vl(auVar102,auVar100);
      auVar102 = vblendps_avx(auVar161,auVar24,8);
      auVar102 = vandps_avx512vl(auVar102,auVar100);
      auVar102 = vmaxps_avx(auVar103,auVar102);
      auVar102 = vmaxps_avx(auVar101,auVar102);
      auVar101 = vmovshdup_avx(auVar102);
      auVar101 = vmaxss_avx(auVar101,auVar102);
      auVar102 = vshufpd_avx(auVar102,auVar102,1);
      auVar102 = vmaxss_avx(auVar102,auVar101);
      auVar213._0_4_ = (float)iVar13;
      _auStack_41c = auVar9._4_12_;
      auVar213._4_4_ = auVar213._0_4_;
      auVar213._8_4_ = auVar213._0_4_;
      auVar213._12_4_ = auVar213._0_4_;
      auVar213._16_4_ = auVar213._0_4_;
      auVar213._20_4_ = auVar213._0_4_;
      auVar213._24_4_ = auVar213._0_4_;
      auVar213._28_4_ = auVar213._0_4_;
      uVar25 = vcmpps_avx512vl(auVar213,_DAT_02020f40,0xe);
      bVar97 = (byte)uVar171 & (byte)uVar25;
      auVar102 = vmulss_avx512f(auVar102,ZEXT416(0x35000000));
      auVar186._8_4_ = 2;
      auVar186._0_8_ = 0x200000002;
      auVar186._12_4_ = 2;
      auVar186._16_4_ = 2;
      auVar186._20_4_ = 2;
      auVar186._24_4_ = 2;
      auVar186._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar186,ZEXT1632(auVar9));
      local_180 = vpermps_avx512vl(auVar186,ZEXT1632(auVar10));
      local_1a0 = vpermps_avx512vl(auVar186,ZEXT1632(auVar8));
      local_1c0 = vpermps_avx2(auVar186,ZEXT1632(auVar161));
      uVar92 = *(uint *)(ray + k * 4 + 0x30);
      auVar101 = local_1e0._0_16_;
      local_420 = auVar213._0_4_;
      if (bVar97 == 0) {
        auVar101 = vxorps_avx512vl(auVar101,auVar101);
        auVar223 = ZEXT1664(auVar101);
        auVar205 = ZEXT3264(auVar110);
        in_ZMM20 = ZEXT3264(local_560);
        auVar188 = ZEXT3264(auVar112);
        in_ZMM21 = ZEXT3264(local_580);
        auVar221 = ZEXT3264(local_4a0);
        auVar220 = ZEXT3264(local_4c0);
        auVar219 = ZEXT3264(local_600);
      }
      else {
        local_4e0._0_16_ = ZEXT416(uVar92);
        local_480._0_16_ = auVar102;
        auVar123 = vmulps_avx512vl(local_1c0,auVar123);
        auVar115 = vfmadd213ps_avx512vl(auVar115,local_1a0,auVar123);
        auVar114 = vfmadd213ps_avx512vl(auVar114,local_180,auVar115);
        auVar114 = vfmadd213ps_avx512vl(auVar113,local_160,auVar114);
        auVar111 = vmulps_avx512vl(local_1c0,auVar111);
        auVar124 = vfmadd213ps_avx512vl(auVar124,local_1a0,auVar111);
        auVar115 = vfmadd213ps_avx512vl(auVar126,local_180,auVar124);
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1210);
        auVar124 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1694);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar26 + 0x1f9c);
        auVar115 = vfmadd213ps_avx512vl(auVar125,local_160,auVar115);
        auVar125 = vmulps_avx512vl(local_5a0,auVar113);
        auVar123 = vmulps_avx512vl(local_5c0,auVar113);
        auVar113 = vmulps_avx512vl(local_1c0,auVar113);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar111,local_e0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar111,local_100);
        auVar111 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar111);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar124,local_600);
        auVar113 = vfmadd231ps_avx512vl(auVar123,auVar124,local_1e0);
        auVar123 = vfmadd231ps_avx512vl(auVar111,local_180,auVar124);
        auVar119 = vfmadd231ps_avx512vl(auVar125,auVar126,local_4a0);
        auVar220 = ZEXT3264(local_4c0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,local_4c0);
        auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1210);
        auVar124 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1b18);
        auVar111 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1f9c);
        auVar123 = vfmadd231ps_avx512vl(auVar123,local_160,auVar126);
        auVar126 = vmulps_avx512vl(local_5a0,auVar111);
        auVar121 = vmulps_avx512vl(local_5c0,auVar111);
        auVar111 = vmulps_avx512vl(local_1c0,auVar111);
        auVar222 = ZEXT1664(auVar102);
        auVar122 = vfmadd231ps_avx512vl(auVar126,auVar124,local_e0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_100);
        auVar124 = vfmadd231ps_avx512vl(auVar111,local_1a0,auVar124);
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar26 + 0x1694);
        auVar111 = vfmadd231ps_avx512vl(auVar122,auVar126,local_600);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_1e0);
        auVar126 = vfmadd231ps_avx512vl(auVar124,local_180,auVar126);
        auVar124 = vfmadd231ps_avx512vl(auVar111,auVar125,local_4a0);
        auVar111 = vfmadd231ps_avx512vl(auVar121,auVar125,local_4c0);
        auVar121 = vfmadd231ps_avx512vl(auVar126,local_160,auVar125);
        auVar217._8_4_ = 0x7fffffff;
        auVar217._0_8_ = 0x7fffffff7fffffff;
        auVar217._12_4_ = 0x7fffffff;
        auVar217._16_4_ = 0x7fffffff;
        auVar217._20_4_ = 0x7fffffff;
        auVar217._24_4_ = 0x7fffffff;
        auVar217._28_4_ = 0x7fffffff;
        auVar125 = vandps_avx(auVar119,auVar217);
        auVar126 = vandps_avx(auVar113,auVar217);
        auVar126 = vmaxps_avx(auVar125,auVar126);
        auVar125 = vandps_avx(auVar123,auVar217);
        auVar125 = vmaxps_avx(auVar126,auVar125);
        auVar123 = vbroadcastss_avx512vl(auVar102);
        uVar88 = vcmpps_avx512vl(auVar125,auVar123,1);
        bVar16 = (bool)((byte)uVar88 & 1);
        auVar127._0_4_ = (float)((uint)bVar16 * auVar108._0_4_ | (uint)!bVar16 * auVar119._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar119._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar119._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar119._12_4_);
        bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar16 * auVar108._16_4_ | (uint)!bVar16 * auVar119._16_4_);
        bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar16 * auVar108._20_4_ | (uint)!bVar16 * auVar119._20_4_);
        bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar16 * auVar108._24_4_ | (uint)!bVar16 * auVar119._24_4_);
        bVar16 = SUB81(uVar88 >> 7,0);
        auVar127._28_4_ = (uint)bVar16 * auVar108._28_4_ | (uint)!bVar16 * auVar119._28_4_;
        bVar16 = (bool)((byte)uVar88 & 1);
        auVar128._0_4_ = (float)((uint)bVar16 * auVar118._0_4_ | (uint)!bVar16 * auVar113._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar16 * auVar118._4_4_ | (uint)!bVar16 * auVar113._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar16 * auVar118._8_4_ | (uint)!bVar16 * auVar113._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar16 * auVar118._12_4_ | (uint)!bVar16 * auVar113._12_4_);
        bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar16 * auVar118._16_4_ | (uint)!bVar16 * auVar113._16_4_);
        bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar16 * auVar118._20_4_ | (uint)!bVar16 * auVar113._20_4_);
        bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar16 * auVar118._24_4_ | (uint)!bVar16 * auVar113._24_4_);
        bVar16 = SUB81(uVar88 >> 7,0);
        auVar128._28_4_ = (uint)bVar16 * auVar118._28_4_ | (uint)!bVar16 * auVar113._28_4_;
        auVar125 = vandps_avx(auVar217,auVar124);
        auVar126 = vandps_avx(auVar111,auVar217);
        auVar126 = vmaxps_avx(auVar125,auVar126);
        auVar125 = vandps_avx(auVar121,auVar217);
        auVar125 = vmaxps_avx(auVar126,auVar125);
        uVar88 = vcmpps_avx512vl(auVar125,auVar123,1);
        bVar16 = (bool)((byte)uVar88 & 1);
        auVar129._0_4_ = (float)((uint)bVar16 * auVar108._0_4_ | (uint)!bVar16 * auVar124._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar16 * auVar108._4_4_ | (uint)!bVar16 * auVar124._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar16 * auVar108._8_4_ | (uint)!bVar16 * auVar124._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar16 * auVar108._12_4_ | (uint)!bVar16 * auVar124._12_4_);
        bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar16 * auVar108._16_4_ | (uint)!bVar16 * auVar124._16_4_);
        bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar16 * auVar108._20_4_ | (uint)!bVar16 * auVar124._20_4_);
        bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar16 * auVar108._24_4_ | (uint)!bVar16 * auVar124._24_4_);
        bVar16 = SUB81(uVar88 >> 7,0);
        auVar129._28_4_ = (uint)bVar16 * auVar108._28_4_ | (uint)!bVar16 * auVar124._28_4_;
        bVar16 = (bool)((byte)uVar88 & 1);
        auVar130._0_4_ = (float)((uint)bVar16 * auVar118._0_4_ | (uint)!bVar16 * auVar111._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar16 * auVar118._4_4_ | (uint)!bVar16 * auVar111._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar16 * auVar118._8_4_ | (uint)!bVar16 * auVar111._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar16 * auVar118._12_4_ | (uint)!bVar16 * auVar111._12_4_);
        bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar130._16_4_ = (float)((uint)bVar16 * auVar118._16_4_ | (uint)!bVar16 * auVar111._16_4_);
        bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar130._20_4_ = (float)((uint)bVar16 * auVar118._20_4_ | (uint)!bVar16 * auVar111._20_4_);
        bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar130._24_4_ = (float)((uint)bVar16 * auVar118._24_4_ | (uint)!bVar16 * auVar111._24_4_);
        bVar16 = SUB81(uVar88 >> 7,0);
        auVar130._28_4_ = (uint)bVar16 * auVar118._28_4_ | (uint)!bVar16 * auVar111._28_4_;
        auVar104 = vxorps_avx512vl(auVar101,auVar101);
        auVar223 = ZEXT1664(auVar104);
        auVar125 = vfmadd213ps_avx512vl(auVar127,auVar127,ZEXT1632(auVar104));
        auVar101 = vfmadd231ps_fma(auVar125,auVar128,auVar128);
        auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
        fVar190 = auVar125._0_4_;
        fVar158 = auVar125._4_4_;
        fVar196 = auVar125._8_4_;
        fVar197 = auVar125._12_4_;
        fVar175 = auVar125._16_4_;
        fVar189 = auVar125._20_4_;
        fVar98 = auVar125._24_4_;
        auVar38._4_4_ = fVar158 * fVar158 * fVar158 * auVar101._4_4_ * -0.5;
        auVar38._0_4_ = fVar190 * fVar190 * fVar190 * auVar101._0_4_ * -0.5;
        auVar38._8_4_ = fVar196 * fVar196 * fVar196 * auVar101._8_4_ * -0.5;
        auVar38._12_4_ = fVar197 * fVar197 * fVar197 * auVar101._12_4_ * -0.5;
        auVar38._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar38._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
        auVar38._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
        auVar38._28_4_ = 0;
        auVar126 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar124 = vfmadd231ps_avx512vl(auVar38,auVar126,auVar125);
        auVar39._4_4_ = auVar128._4_4_ * auVar124._4_4_;
        auVar39._0_4_ = auVar128._0_4_ * auVar124._0_4_;
        auVar39._8_4_ = auVar128._8_4_ * auVar124._8_4_;
        auVar39._12_4_ = auVar128._12_4_ * auVar124._12_4_;
        auVar39._16_4_ = auVar128._16_4_ * auVar124._16_4_;
        auVar39._20_4_ = auVar128._20_4_ * auVar124._20_4_;
        auVar39._24_4_ = auVar128._24_4_ * auVar124._24_4_;
        auVar39._28_4_ = auVar125._28_4_;
        auVar40._4_4_ = auVar124._4_4_ * -auVar127._4_4_;
        auVar40._0_4_ = auVar124._0_4_ * -auVar127._0_4_;
        auVar40._8_4_ = auVar124._8_4_ * -auVar127._8_4_;
        auVar40._12_4_ = auVar124._12_4_ * -auVar127._12_4_;
        auVar40._16_4_ = auVar124._16_4_ * -auVar127._16_4_;
        auVar40._20_4_ = auVar124._20_4_ * -auVar127._20_4_;
        auVar40._24_4_ = auVar124._24_4_ * -auVar127._24_4_;
        auVar40._28_4_ = auVar127._28_4_ ^ 0x80000000;
        auVar125 = vmulps_avx512vl(auVar124,ZEXT1632(auVar104));
        auVar108 = ZEXT1632(auVar104);
        auVar111 = vfmadd213ps_avx512vl(auVar129,auVar129,auVar108);
        auVar101 = vfmadd231ps_fma(auVar111,auVar130,auVar130);
        auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
        fVar190 = auVar111._0_4_;
        fVar158 = auVar111._4_4_;
        fVar196 = auVar111._8_4_;
        fVar197 = auVar111._12_4_;
        fVar175 = auVar111._16_4_;
        fVar189 = auVar111._20_4_;
        fVar98 = auVar111._24_4_;
        auVar41._4_4_ = fVar158 * fVar158 * fVar158 * auVar101._4_4_ * -0.5;
        auVar41._0_4_ = fVar190 * fVar190 * fVar190 * auVar101._0_4_ * -0.5;
        auVar41._8_4_ = fVar196 * fVar196 * fVar196 * auVar101._8_4_ * -0.5;
        auVar41._12_4_ = fVar197 * fVar197 * fVar197 * auVar101._12_4_ * -0.5;
        auVar41._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
        auVar41._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
        auVar41._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
        auVar41._28_4_ = 0;
        auVar126 = vfmadd231ps_avx512vl(auVar41,auVar126,auVar111);
        auVar42._4_4_ = auVar130._4_4_ * auVar126._4_4_;
        auVar42._0_4_ = auVar130._0_4_ * auVar126._0_4_;
        auVar42._8_4_ = auVar130._8_4_ * auVar126._8_4_;
        auVar42._12_4_ = auVar130._12_4_ * auVar126._12_4_;
        auVar42._16_4_ = auVar130._16_4_ * auVar126._16_4_;
        auVar42._20_4_ = auVar130._20_4_ * auVar126._20_4_;
        auVar42._24_4_ = auVar130._24_4_ * auVar126._24_4_;
        auVar42._28_4_ = auVar111._28_4_;
        auVar43._4_4_ = -auVar129._4_4_ * auVar126._4_4_;
        auVar43._0_4_ = -auVar129._0_4_ * auVar126._0_4_;
        auVar43._8_4_ = -auVar129._8_4_ * auVar126._8_4_;
        auVar43._12_4_ = -auVar129._12_4_ * auVar126._12_4_;
        auVar43._16_4_ = -auVar129._16_4_ * auVar126._16_4_;
        auVar43._20_4_ = -auVar129._20_4_ * auVar126._20_4_;
        auVar43._24_4_ = -auVar129._24_4_ * auVar126._24_4_;
        auVar43._28_4_ = auVar124._28_4_;
        auVar126 = vmulps_avx512vl(auVar126,auVar108);
        auVar101 = vfmadd213ps_fma(auVar39,auVar120,auVar109);
        auVar161 = vfmadd213ps_fma(auVar40,auVar120,auVar116);
        auVar124 = vfmadd213ps_avx512vl(auVar125,auVar120,auVar115);
        auVar111 = vfmadd213ps_avx512vl(auVar42,ZEXT1632(auVar160),auVar117);
        auVar24 = vfnmadd213ps_fma(auVar39,auVar120,auVar109);
        auVar123 = ZEXT1632(auVar160);
        auVar100 = vfmadd213ps_fma(auVar43,auVar123,auVar107);
        auVar103 = vfnmadd213ps_fma(auVar40,auVar120,auVar116);
        auVar8 = vfmadd213ps_fma(auVar126,auVar123,auVar114);
        auVar113 = vfnmadd231ps_avx512vl(auVar115,auVar120,auVar125);
        auVar176 = vfnmadd213ps_fma(auVar42,auVar123,auVar117);
        auVar177 = vfnmadd213ps_fma(auVar43,auVar123,auVar107);
        auVar206 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar160),auVar126);
        auVar126 = vsubps_avx512vl(auVar111,ZEXT1632(auVar24));
        auVar125 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar103));
        auVar114 = vsubps_avx512vl(ZEXT1632(auVar8),auVar113);
        auVar115 = vmulps_avx512vl(auVar125,auVar113);
        auVar9 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar103),auVar114);
        auVar44._4_4_ = auVar24._4_4_ * auVar114._4_4_;
        auVar44._0_4_ = auVar24._0_4_ * auVar114._0_4_;
        auVar44._8_4_ = auVar24._8_4_ * auVar114._8_4_;
        auVar44._12_4_ = auVar24._12_4_ * auVar114._12_4_;
        auVar44._16_4_ = auVar114._16_4_ * 0.0;
        auVar44._20_4_ = auVar114._20_4_ * 0.0;
        auVar44._24_4_ = auVar114._24_4_ * 0.0;
        auVar44._28_4_ = auVar114._28_4_;
        auVar114 = vfmsub231ps_avx512vl(auVar44,auVar113,auVar126);
        auVar45._4_4_ = auVar103._4_4_ * auVar126._4_4_;
        auVar45._0_4_ = auVar103._0_4_ * auVar126._0_4_;
        auVar45._8_4_ = auVar103._8_4_ * auVar126._8_4_;
        auVar45._12_4_ = auVar103._12_4_ * auVar126._12_4_;
        auVar45._16_4_ = auVar126._16_4_ * 0.0;
        auVar45._20_4_ = auVar126._20_4_ * 0.0;
        auVar45._24_4_ = auVar126._24_4_ * 0.0;
        auVar45._28_4_ = auVar126._28_4_;
        auVar10 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar24),auVar125);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar108,auVar114);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar108,ZEXT1632(auVar9));
        auVar107 = ZEXT1632(auVar104);
        uVar88 = vcmpps_avx512vl(auVar125,auVar107,2);
        bVar87 = (byte)uVar88;
        fVar98 = (float)((uint)(bVar87 & 1) * auVar101._0_4_ |
                        (uint)!(bool)(bVar87 & 1) * auVar176._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar174 = (float)((uint)bVar16 * auVar101._4_4_ | (uint)!bVar16 * auVar176._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar151 = (float)((uint)bVar16 * auVar101._8_4_ | (uint)!bVar16 * auVar176._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar154 = (float)((uint)bVar16 * auVar101._12_4_ | (uint)!bVar16 * auVar176._12_4_);
        auVar115 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar151,CONCAT44(fVar174,fVar98))));
        fVar99 = (float)((uint)(bVar87 & 1) * auVar161._0_4_ |
                        (uint)!(bool)(bVar87 & 1) * auVar177._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar150 = (float)((uint)bVar16 * auVar161._4_4_ | (uint)!bVar16 * auVar177._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar152 = (float)((uint)bVar16 * auVar161._8_4_ | (uint)!bVar16 * auVar177._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar155 = (float)((uint)bVar16 * auVar161._12_4_ | (uint)!bVar16 * auVar177._12_4_);
        auVar123 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar152,CONCAT44(fVar150,fVar99))));
        auVar131._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar124._0_4_ |
                    (uint)!(bool)(bVar87 & 1) * auVar206._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar131._4_4_ = (float)((uint)bVar16 * auVar124._4_4_ | (uint)!bVar16 * auVar206._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar131._8_4_ = (float)((uint)bVar16 * auVar124._8_4_ | (uint)!bVar16 * auVar206._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar131._12_4_ = (float)((uint)bVar16 * auVar124._12_4_ | (uint)!bVar16 * auVar206._12_4_);
        fVar190 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar124._16_4_);
        auVar131._16_4_ = fVar190;
        fVar158 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar124._20_4_);
        auVar131._20_4_ = fVar158;
        fVar196 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar124._24_4_);
        auVar131._24_4_ = fVar196;
        iVar1 = (uint)(byte)(uVar88 >> 7) * auVar124._28_4_;
        auVar131._28_4_ = iVar1;
        auVar126 = vblendmps_avx512vl(ZEXT1632(auVar24),auVar111);
        auVar132._0_4_ =
             (uint)(bVar87 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar9._0_4_;
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar9._4_4_;
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar9._8_4_;
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar9._12_4_;
        auVar132._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar126._16_4_;
        auVar132._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar126._20_4_;
        auVar132._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar126._24_4_;
        auVar132._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar126._28_4_;
        auVar126 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar100));
        auVar133._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar126._0_4_ |
                    (uint)!(bool)(bVar87 & 1) * auVar161._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar161._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar161._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar161._12_4_);
        fVar197 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar126._16_4_);
        auVar133._16_4_ = fVar197;
        fVar175 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar126._20_4_);
        auVar133._20_4_ = fVar175;
        fVar189 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar126._24_4_);
        auVar133._24_4_ = fVar189;
        auVar133._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar126._28_4_;
        auVar126 = vblendmps_avx512vl(auVar113,ZEXT1632(auVar8));
        auVar134._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar126._0_4_ |
                    (uint)!(bool)(bVar87 & 1) * auVar124._0_4_);
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar134._4_4_ = (float)((uint)bVar16 * auVar126._4_4_ | (uint)!bVar16 * auVar124._4_4_);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar134._8_4_ = (float)((uint)bVar16 * auVar126._8_4_ | (uint)!bVar16 * auVar124._8_4_);
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar134._12_4_ = (float)((uint)bVar16 * auVar126._12_4_ | (uint)!bVar16 * auVar124._12_4_);
        bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar134._16_4_ = (float)((uint)bVar16 * auVar126._16_4_ | (uint)!bVar16 * auVar124._16_4_);
        bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar134._20_4_ = (float)((uint)bVar16 * auVar126._20_4_ | (uint)!bVar16 * auVar124._20_4_);
        bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar134._24_4_ = (float)((uint)bVar16 * auVar126._24_4_ | (uint)!bVar16 * auVar124._24_4_);
        bVar16 = SUB81(uVar88 >> 7,0);
        auVar134._28_4_ = (uint)bVar16 * auVar126._28_4_ | (uint)!bVar16 * auVar124._28_4_;
        auVar135._0_4_ =
             (uint)(bVar87 & 1) * (int)auVar24._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar111._0_4_;
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar16 * (int)auVar24._4_4_ | (uint)!bVar16 * auVar111._4_4_;
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar16 * (int)auVar24._8_4_ | (uint)!bVar16 * auVar111._8_4_;
        bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar16 * (int)auVar24._12_4_ | (uint)!bVar16 * auVar111._12_4_;
        auVar135._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar111._16_4_;
        auVar135._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar111._20_4_;
        auVar135._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar111._24_4_;
        auVar135._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar111._28_4_;
        bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar88 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar136._0_4_ =
             (uint)(bVar87 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar8._0_4_;
        bVar17 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * auVar8._4_4_;
        bVar17 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * auVar8._8_4_;
        bVar17 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * auVar8._12_4_;
        auVar136._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar113._16_4_;
        auVar136._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar113._20_4_;
        auVar136._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar113._24_4_;
        iVar2 = (uint)(byte)(uVar88 >> 7) * auVar113._28_4_;
        auVar136._28_4_ = iVar2;
        auVar109 = vsubps_avx512vl(auVar135,auVar115);
        auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar103._12_4_ |
                                                 (uint)!bVar19 * auVar100._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar103._8_4_ |
                                                          (uint)!bVar18 * auVar100._8_4_,
                                                          CONCAT44((uint)bVar16 *
                                                                   (int)auVar103._4_4_ |
                                                                   (uint)!bVar16 * auVar100._4_4_,
                                                                   (uint)(bVar87 & 1) *
                                                                   (int)auVar103._0_4_ |
                                                                   (uint)!(bool)(bVar87 & 1) *
                                                                   auVar100._0_4_)))),auVar123);
        auVar124 = vsubps_avx(auVar136,auVar131);
        auVar111 = vsubps_avx(auVar115,auVar132);
        auVar113 = vsubps_avx(auVar123,auVar133);
        auVar114 = vsubps_avx(auVar131,auVar134);
        auVar46._4_4_ = auVar124._4_4_ * fVar174;
        auVar46._0_4_ = auVar124._0_4_ * fVar98;
        auVar46._8_4_ = auVar124._8_4_ * fVar151;
        auVar46._12_4_ = auVar124._12_4_ * fVar154;
        auVar46._16_4_ = auVar124._16_4_ * 0.0;
        auVar46._20_4_ = auVar124._20_4_ * 0.0;
        auVar46._24_4_ = auVar124._24_4_ * 0.0;
        auVar46._28_4_ = iVar2;
        auVar101 = vfmsub231ps_fma(auVar46,auVar131,auVar109);
        auVar47._4_4_ = fVar150 * auVar109._4_4_;
        auVar47._0_4_ = fVar99 * auVar109._0_4_;
        auVar47._8_4_ = fVar152 * auVar109._8_4_;
        auVar47._12_4_ = fVar155 * auVar109._12_4_;
        auVar47._16_4_ = auVar109._16_4_ * 0.0;
        auVar47._20_4_ = auVar109._20_4_ * 0.0;
        auVar47._24_4_ = auVar109._24_4_ * 0.0;
        auVar47._28_4_ = auVar125._28_4_;
        auVar161 = vfmsub231ps_fma(auVar47,auVar115,auVar126);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar161),auVar107,ZEXT1632(auVar101));
        auVar192._0_4_ = auVar126._0_4_ * auVar131._0_4_;
        auVar192._4_4_ = auVar126._4_4_ * auVar131._4_4_;
        auVar192._8_4_ = auVar126._8_4_ * auVar131._8_4_;
        auVar192._12_4_ = auVar126._12_4_ * auVar131._12_4_;
        auVar192._16_4_ = auVar126._16_4_ * fVar190;
        auVar192._20_4_ = auVar126._20_4_ * fVar158;
        auVar192._24_4_ = auVar126._24_4_ * fVar196;
        auVar192._28_4_ = 0;
        auVar101 = vfmsub231ps_fma(auVar192,auVar123,auVar124);
        auVar116 = vfmadd231ps_avx512vl(auVar125,auVar107,ZEXT1632(auVar101));
        auVar125 = vmulps_avx512vl(auVar114,auVar132);
        auVar125 = vfmsub231ps_avx512vl(auVar125,auVar111,auVar134);
        auVar48._4_4_ = auVar113._4_4_ * auVar134._4_4_;
        auVar48._0_4_ = auVar113._0_4_ * auVar134._0_4_;
        auVar48._8_4_ = auVar113._8_4_ * auVar134._8_4_;
        auVar48._12_4_ = auVar113._12_4_ * auVar134._12_4_;
        auVar48._16_4_ = auVar113._16_4_ * auVar134._16_4_;
        auVar48._20_4_ = auVar113._20_4_ * auVar134._20_4_;
        auVar48._24_4_ = auVar113._24_4_ * auVar134._24_4_;
        auVar48._28_4_ = auVar134._28_4_;
        auVar101 = vfmsub231ps_fma(auVar48,auVar133,auVar114);
        auVar193._0_4_ = auVar133._0_4_ * auVar111._0_4_;
        auVar193._4_4_ = auVar133._4_4_ * auVar111._4_4_;
        auVar193._8_4_ = auVar133._8_4_ * auVar111._8_4_;
        auVar193._12_4_ = auVar133._12_4_ * auVar111._12_4_;
        auVar193._16_4_ = fVar197 * auVar111._16_4_;
        auVar193._20_4_ = fVar175 * auVar111._20_4_;
        auVar193._24_4_ = fVar189 * auVar111._24_4_;
        auVar193._28_4_ = 0;
        auVar161 = vfmsub231ps_fma(auVar193,auVar113,auVar132);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar161),auVar107,auVar125);
        auVar117 = vfmadd231ps_avx512vl(auVar125,auVar107,ZEXT1632(auVar101));
        auVar125 = vmaxps_avx(auVar116,auVar117);
        uVar171 = vcmpps_avx512vl(auVar125,auVar107,2);
        bVar97 = bVar97 & (byte)uVar171;
        in_ZMM20 = ZEXT3264(local_560);
        in_ZMM21 = ZEXT3264(local_580);
        auVar221 = ZEXT3264(local_4a0);
        auVar219 = ZEXT3264(local_600);
        if (bVar97 == 0) {
          bVar97 = 0;
          auVar205 = ZEXT3264(auVar110);
          auVar188 = ZEXT3264(auVar112);
        }
        else {
          auVar49._4_4_ = auVar114._4_4_ * auVar126._4_4_;
          auVar49._0_4_ = auVar114._0_4_ * auVar126._0_4_;
          auVar49._8_4_ = auVar114._8_4_ * auVar126._8_4_;
          auVar49._12_4_ = auVar114._12_4_ * auVar126._12_4_;
          auVar49._16_4_ = auVar114._16_4_ * auVar126._16_4_;
          auVar49._20_4_ = auVar114._20_4_ * auVar126._20_4_;
          auVar49._24_4_ = auVar114._24_4_ * auVar126._24_4_;
          auVar49._28_4_ = auVar125._28_4_;
          auVar100 = vfmsub231ps_fma(auVar49,auVar113,auVar124);
          auVar50._4_4_ = auVar124._4_4_ * auVar111._4_4_;
          auVar50._0_4_ = auVar124._0_4_ * auVar111._0_4_;
          auVar50._8_4_ = auVar124._8_4_ * auVar111._8_4_;
          auVar50._12_4_ = auVar124._12_4_ * auVar111._12_4_;
          auVar50._16_4_ = auVar124._16_4_ * auVar111._16_4_;
          auVar50._20_4_ = auVar124._20_4_ * auVar111._20_4_;
          auVar50._24_4_ = auVar124._24_4_ * auVar111._24_4_;
          auVar50._28_4_ = auVar124._28_4_;
          auVar161 = vfmsub231ps_fma(auVar50,auVar109,auVar114);
          auVar51._4_4_ = auVar113._4_4_ * auVar109._4_4_;
          auVar51._0_4_ = auVar113._0_4_ * auVar109._0_4_;
          auVar51._8_4_ = auVar113._8_4_ * auVar109._8_4_;
          auVar51._12_4_ = auVar113._12_4_ * auVar109._12_4_;
          auVar51._16_4_ = auVar113._16_4_ * auVar109._16_4_;
          auVar51._20_4_ = auVar113._20_4_ * auVar109._20_4_;
          auVar51._24_4_ = auVar113._24_4_ * auVar109._24_4_;
          auVar51._28_4_ = auVar113._28_4_;
          auVar8 = vfmsub231ps_fma(auVar51,auVar111,auVar126);
          auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar161),ZEXT1632(auVar8));
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar100),auVar107);
          auVar126 = vrcp14ps_avx512vl(auVar125);
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = &DAT_3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar27._16_4_ = 0x3f800000;
          auVar27._20_4_ = 0x3f800000;
          auVar27._24_4_ = 0x3f800000;
          auVar27._28_4_ = 0x3f800000;
          auVar124 = vfnmadd213ps_avx512vl(auVar126,auVar125,auVar27);
          auVar101 = vfmadd132ps_fma(auVar124,auVar126,auVar126);
          auVar52._4_4_ = auVar8._4_4_ * auVar131._4_4_;
          auVar52._0_4_ = auVar8._0_4_ * auVar131._0_4_;
          auVar52._8_4_ = auVar8._8_4_ * auVar131._8_4_;
          auVar52._12_4_ = auVar8._12_4_ * auVar131._12_4_;
          auVar52._16_4_ = fVar190 * 0.0;
          auVar52._20_4_ = fVar158 * 0.0;
          auVar52._24_4_ = fVar196 * 0.0;
          auVar52._28_4_ = iVar1;
          auVar161 = vfmadd231ps_fma(auVar52,auVar123,ZEXT1632(auVar161));
          auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar115,ZEXT1632(auVar100));
          fVar190 = auVar101._0_4_;
          fVar158 = auVar101._4_4_;
          fVar196 = auVar101._8_4_;
          fVar197 = auVar101._12_4_;
          auVar126 = ZEXT1632(CONCAT412(auVar161._12_4_ * fVar197,
                                        CONCAT48(auVar161._8_4_ * fVar196,
                                                 CONCAT44(auVar161._4_4_ * fVar158,
                                                          auVar161._0_4_ * fVar190))));
          auVar208._4_4_ = uVar92;
          auVar208._0_4_ = uVar92;
          auVar208._8_4_ = uVar92;
          auVar208._12_4_ = uVar92;
          auVar208._16_4_ = uVar92;
          auVar208._20_4_ = uVar92;
          auVar208._24_4_ = uVar92;
          auVar208._28_4_ = uVar92;
          uVar171 = vcmpps_avx512vl(auVar208,auVar126,2);
          uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar28._4_4_ = uVar159;
          auVar28._0_4_ = uVar159;
          auVar28._8_4_ = uVar159;
          auVar28._12_4_ = uVar159;
          auVar28._16_4_ = uVar159;
          auVar28._20_4_ = uVar159;
          auVar28._24_4_ = uVar159;
          auVar28._28_4_ = uVar159;
          uVar25 = vcmpps_avx512vl(auVar126,auVar28,2);
          bVar97 = (byte)uVar171 & (byte)uVar25 & bVar97;
          if (bVar97 == 0) {
            bVar97 = 0;
            auVar205 = ZEXT3264(auVar110);
            auVar188 = ZEXT3264(auVar112);
          }
          else {
            uVar171 = vcmpps_avx512vl(auVar125,auVar107,4);
            if ((bVar97 & (byte)uVar171) == 0) {
              bVar97 = 0;
              auVar205 = ZEXT3264(auVar110);
              auVar188 = ZEXT3264(auVar112);
            }
            else {
              bVar97 = bVar97 & (byte)uVar171;
              fVar175 = auVar116._0_4_ * fVar190;
              fVar189 = auVar116._4_4_ * fVar158;
              auVar53._4_4_ = fVar189;
              auVar53._0_4_ = fVar175;
              fVar98 = auVar116._8_4_ * fVar196;
              auVar53._8_4_ = fVar98;
              fVar99 = auVar116._12_4_ * fVar197;
              auVar53._12_4_ = fVar99;
              fVar174 = auVar116._16_4_ * 0.0;
              auVar53._16_4_ = fVar174;
              fVar150 = auVar116._20_4_ * 0.0;
              auVar53._20_4_ = fVar150;
              fVar151 = auVar116._24_4_ * 0.0;
              auVar53._24_4_ = fVar151;
              auVar53._28_4_ = auVar116._28_4_;
              fVar190 = auVar117._0_4_ * fVar190;
              fVar158 = auVar117._4_4_ * fVar158;
              auVar54._4_4_ = fVar158;
              auVar54._0_4_ = fVar190;
              fVar196 = auVar117._8_4_ * fVar196;
              auVar54._8_4_ = fVar196;
              fVar197 = auVar117._12_4_ * fVar197;
              auVar54._12_4_ = fVar197;
              fVar152 = auVar117._16_4_ * 0.0;
              auVar54._16_4_ = fVar152;
              fVar154 = auVar117._20_4_ * 0.0;
              auVar54._20_4_ = fVar154;
              fVar155 = auVar117._24_4_ * 0.0;
              auVar54._24_4_ = fVar155;
              auVar54._28_4_ = auVar117._28_4_;
              auVar202._8_4_ = 0x3f800000;
              auVar202._0_8_ = &DAT_3f8000003f800000;
              auVar202._12_4_ = 0x3f800000;
              auVar202._16_4_ = 0x3f800000;
              auVar202._20_4_ = 0x3f800000;
              auVar202._24_4_ = 0x3f800000;
              auVar202._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar202,auVar53);
              bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar88 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar88 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar88 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar88 >> 6) & 1);
              bVar22 = SUB81(uVar88 >> 7,0);
              auVar205 = ZEXT3264(CONCAT428((uint)bVar22 * auVar116._28_4_ |
                                            (uint)!bVar22 * auVar112._28_4_,
                                            CONCAT424((uint)bVar21 * (int)fVar151 |
                                                      (uint)!bVar21 * auVar112._24_4_,
                                                      CONCAT420((uint)bVar20 * (int)fVar150 |
                                                                (uint)!bVar20 * auVar112._20_4_,
                                                                CONCAT416((uint)bVar19 *
                                                                          (int)fVar174 |
                                                                          (uint)!bVar19 *
                                                                          auVar112._16_4_,
                                                                          CONCAT412((uint)bVar18 *
                                                                                    (int)fVar99 |
                                                                                    (uint)!bVar18 *
                                                                                    auVar112._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar17 * (int)fVar98 |
                                                  (uint)!bVar17 * auVar112._8_4_,
                                                  CONCAT44((uint)bVar16 * (int)fVar189 |
                                                           (uint)!bVar16 * auVar112._4_4_,
                                                           (uint)(bVar87 & 1) * (int)fVar175 |
                                                           (uint)!(bool)(bVar87 & 1) *
                                                           auVar112._0_4_))))))));
              auVar112 = vsubps_avx(auVar202,auVar54);
              bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar88 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar88 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar88 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar88 >> 6) & 1);
              bVar22 = SUB81(uVar88 >> 7,0);
              local_220._4_4_ = (uint)bVar16 * (int)fVar158 | (uint)!bVar16 * auVar112._4_4_;
              local_220._0_4_ =
                   (uint)(bVar87 & 1) * (int)fVar190 | (uint)!(bool)(bVar87 & 1) * auVar112._0_4_;
              local_220._8_4_ = (uint)bVar17 * (int)fVar196 | (uint)!bVar17 * auVar112._8_4_;
              local_220._12_4_ = (uint)bVar18 * (int)fVar197 | (uint)!bVar18 * auVar112._12_4_;
              local_220._16_4_ = (uint)bVar19 * (int)fVar152 | (uint)!bVar19 * auVar112._16_4_;
              local_220._20_4_ = (uint)bVar20 * (int)fVar154 | (uint)!bVar20 * auVar112._20_4_;
              local_220._24_4_ = (uint)bVar21 * (int)fVar155 | (uint)!bVar21 * auVar112._24_4_;
              local_220._28_4_ = (uint)bVar22 * auVar117._28_4_ | (uint)!bVar22 * auVar112._28_4_;
              auVar188 = ZEXT3264(auVar126);
            }
          }
        }
        auVar225 = ZEXT3264(local_5c0);
        auVar224 = ZEXT3264(local_5a0);
        if (bVar97 != 0) {
          auVar112 = vsubps_avx(ZEXT1632(auVar160),auVar120);
          auVar125 = auVar205._0_32_;
          auVar101 = vfmadd213ps_fma(auVar112,auVar125,auVar120);
          uVar159 = *(undefined4 *)((long)local_678->ray_space + k * 4 + -0x10);
          auVar29._4_4_ = uVar159;
          auVar29._0_4_ = uVar159;
          auVar29._8_4_ = uVar159;
          auVar29._12_4_ = uVar159;
          auVar29._16_4_ = uVar159;
          auVar29._20_4_ = uVar159;
          auVar29._24_4_ = uVar159;
          auVar29._28_4_ = uVar159;
          auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar101._12_4_ + auVar101._12_4_,
                                                        CONCAT48(auVar101._8_4_ + auVar101._8_4_,
                                                                 CONCAT44(auVar101._4_4_ +
                                                                          auVar101._4_4_,
                                                                          auVar101._0_4_ +
                                                                          auVar101._0_4_)))),auVar29
                                    );
          auVar110 = auVar188._0_32_;
          uVar171 = vcmpps_avx512vl(auVar110,auVar112,6);
          bVar97 = bVar97 & (byte)uVar171;
          if (bVar97 != 0) {
            auVar164._8_4_ = 0xbf800000;
            auVar164._0_8_ = 0xbf800000bf800000;
            auVar164._12_4_ = 0xbf800000;
            auVar164._16_4_ = 0xbf800000;
            auVar164._20_4_ = 0xbf800000;
            auVar164._24_4_ = 0xbf800000;
            auVar164._28_4_ = 0xbf800000;
            auVar30._8_4_ = 0x40000000;
            auVar30._0_8_ = 0x4000000040000000;
            auVar30._12_4_ = 0x40000000;
            auVar30._16_4_ = 0x40000000;
            auVar30._20_4_ = 0x40000000;
            auVar30._24_4_ = 0x40000000;
            auVar30._28_4_ = 0x40000000;
            local_3e0 = vfmadd132ps_avx512vl(local_220,auVar164,auVar30);
            local_220 = local_3e0;
            auVar112 = local_220;
            local_3a0 = 0;
            local_220 = auVar112;
            if ((pGVar93->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar190 = 1.0 / auVar213._0_4_;
              local_340[0] = fVar190 * (auVar205._0_4_ + 0.0);
              local_340[1] = fVar190 * (auVar205._4_4_ + 1.0);
              local_340[2] = fVar190 * (auVar205._8_4_ + 2.0);
              local_340[3] = fVar190 * (auVar205._12_4_ + 3.0);
              fStack_330 = fVar190 * (auVar205._16_4_ + 4.0);
              fStack_32c = fVar190 * (auVar205._20_4_ + 5.0);
              fStack_328 = fVar190 * (auVar205._24_4_ + 6.0);
              fStack_324 = auVar205._28_4_ + 7.0;
              local_220._0_8_ = local_3e0._0_8_;
              local_220._8_8_ = local_3e0._8_8_;
              local_220._16_8_ = local_3e0._16_8_;
              local_220._24_8_ = local_3e0._24_8_;
              local_320 = local_220._0_8_;
              uStack_318 = local_220._8_8_;
              uStack_310 = local_220._16_8_;
              uStack_308 = local_220._24_8_;
              local_300 = auVar110;
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar112 = vblendmps_avx512vl(auVar165,auVar110);
              auVar137._0_4_ =
                   (uint)(bVar97 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar97 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar97 >> 1 & 1);
              auVar137._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar97 >> 2 & 1);
              auVar137._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar97 >> 3 & 1);
              auVar137._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar97 >> 4 & 1);
              auVar137._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar97 >> 5 & 1);
              auVar137._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar97 >> 6 & 1);
              auVar137._24_4_ = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar137._28_4_ =
                   (uint)(bVar97 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
              auVar112 = vshufps_avx(auVar137,auVar137,0xb1);
              auVar112 = vminps_avx(auVar137,auVar112);
              auVar126 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar126);
              auVar126 = vpermpd_avx2(auVar112,0x4e);
              auVar112 = vminps_avx(auVar112,auVar126);
              uVar171 = vcmpps_avx512vl(auVar137,auVar112,0);
              bVar86 = (byte)uVar171 & bVar97;
              bVar87 = bVar97;
              if (bVar86 != 0) {
                bVar87 = bVar86;
              }
              uVar90 = 0;
              for (uVar89 = (uint)bVar87; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                uVar90 = uVar90 + 1;
              }
              uVar88 = (ulong)uVar90;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar93->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar190 = local_340[uVar88];
                uVar159 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                fVar158 = 1.0 - fVar190;
                auVar100 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar158 + fVar158))),
                                            ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                auVar160 = ZEXT416((uint)fVar190);
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar160,
                                           ZEXT416(0xc0a00000));
                auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                           ZEXT416((uint)(fVar190 + fVar190)),auVar101);
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar160,
                                           ZEXT416(0x40000000));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                           ZEXT416((uint)(fVar158 + fVar158)),auVar101);
                auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar160,
                                           ZEXT416((uint)(fVar158 * -2.0)));
                fVar158 = auVar100._0_4_ * 0.5;
                fVar196 = auVar161._0_4_ * 0.5;
                fVar197 = auVar101._0_4_ * 0.5;
                fVar175 = auVar160._0_4_ * 0.5;
                auVar178._0_4_ = fVar175 * local_620;
                auVar178._4_4_ = fVar175 * fStack_61c;
                auVar178._8_4_ = fVar175 * fStack_618;
                auVar178._12_4_ = fVar175 * fStack_614;
                auVar198._4_4_ = fVar197;
                auVar198._0_4_ = fVar197;
                auVar198._8_4_ = fVar197;
                auVar198._12_4_ = fVar197;
                auVar101 = vfmadd132ps_fma(auVar198,auVar178,*pauVar4);
                auVar179._4_4_ = fVar196;
                auVar179._0_4_ = fVar196;
                auVar179._8_4_ = fVar196;
                auVar179._12_4_ = fVar196;
                auVar101 = vfmadd132ps_fma(auVar179,auVar101,*pauVar3);
                auVar205 = ZEXT3264(auVar125);
                auVar172._4_4_ = fVar158;
                auVar172._0_4_ = fVar158;
                auVar172._8_4_ = fVar158;
                auVar172._12_4_ = fVar158;
                auVar101 = vfmadd213ps_fma(auVar172,auVar23,auVar101);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                auVar188 = ZEXT3264(auVar110);
                *(int *)(ray + k * 4 + 0xc0) = auVar101._0_4_;
                uVar14 = vextractps_avx(auVar101,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar14;
                uVar14 = vextractps_avx(auVar101,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                *(float *)(ray + k * 4 + 0xf0) = fVar190;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar159;
                *(uint *)(ray + k * 4 + 0x110) = uVar12;
                *(uint *)(ray + k * 4 + 0x120) = uVar94;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_510 = vpbroadcastd_avx512vl();
                local_5d0 = vpbroadcastd_avx512vl();
                local_520 = (undefined4)local_660;
                uStack_51c = (undefined4)((ulong)local_660 >> 0x20);
                local_540 = local_620;
                fStack_53c = fStack_61c;
                fStack_538 = fStack_618;
                fStack_534 = fStack_614;
                local_530 = local_670;
                uStack_528 = uStack_668;
                uStack_518 = uStack_658;
                local_400 = auVar125;
                local_3c0 = auVar110;
                local_39c = iVar13;
                local_390 = auVar23;
                local_380 = local_660;
                uStack_378 = uStack_658;
                local_370 = local_670;
                uStack_368 = uStack_668;
                local_350 = bVar97;
                do {
                  auVar100 = auVar223._0_16_;
                  local_500._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar190 = local_340[uVar88];
                  local_2a0._4_4_ = fVar190;
                  local_2a0._0_4_ = fVar190;
                  local_2a0._8_4_ = fVar190;
                  local_2a0._12_4_ = fVar190;
                  local_290 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                  local_650.context = context->user;
                  fVar158 = 1.0 - fVar190;
                  auVar160 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar158 + fVar158))),
                                              ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                  auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_2a0,
                                             ZEXT416(0xc0a00000));
                  auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                             ZEXT416((uint)(fVar190 + fVar190)),auVar102);
                  auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_2a0,
                                             ZEXT416(0x40000000));
                  auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                             ZEXT416((uint)(fVar158 + fVar158)),auVar102);
                  auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),local_2a0,
                                             ZEXT416((uint)(fVar158 * -2.0)));
                  fVar190 = auVar160._0_4_ * 0.5;
                  fVar158 = auVar101._0_4_ * 0.5;
                  fVar196 = auVar102._0_4_ * 0.5;
                  fVar197 = auVar161._0_4_ * 0.5;
                  auVar184._0_4_ = fVar197 * local_540;
                  auVar184._4_4_ = fVar197 * fStack_53c;
                  auVar184._8_4_ = fVar197 * fStack_538;
                  auVar184._12_4_ = fVar197 * fStack_534;
                  auVar201._4_4_ = fVar196;
                  auVar201._0_4_ = fVar196;
                  auVar201._8_4_ = fVar196;
                  auVar201._12_4_ = fVar196;
                  auVar83._8_8_ = uStack_528;
                  auVar83._0_8_ = local_530;
                  auVar102 = vfmadd132ps_fma(auVar201,auVar184,auVar83);
                  auVar185._4_4_ = fVar158;
                  auVar185._0_4_ = fVar158;
                  auVar185._8_4_ = fVar158;
                  auVar185._12_4_ = fVar158;
                  auVar84._4_4_ = uStack_51c;
                  auVar84._0_4_ = local_520;
                  auVar84._8_8_ = uStack_518;
                  auVar102 = vfmadd132ps_fma(auVar185,auVar102,auVar84);
                  auVar163._4_4_ = fVar190;
                  auVar163._0_4_ = fVar190;
                  auVar163._8_4_ = fVar190;
                  auVar163._12_4_ = fVar190;
                  auVar102 = vfmadd213ps_fma(auVar163,auVar23,auVar102);
                  local_2d0 = auVar102._0_4_;
                  local_2c0 = vshufps_avx(auVar102,auVar102,0x55);
                  local_2b0 = vshufps_avx(auVar102,auVar102,0xaa);
                  iStack_2cc = local_2d0;
                  iStack_2c8 = local_2d0;
                  iStack_2c4 = local_2d0;
                  uStack_28c = local_290;
                  uStack_288 = local_290;
                  uStack_284 = local_290;
                  local_280 = local_5d0._0_8_;
                  uStack_278 = local_5d0._8_8_;
                  local_270 = local_510;
                  vpcmpeqd_avx2(ZEXT1632(local_510),ZEXT1632(local_510));
                  uStack_25c = (local_650.context)->instID[0];
                  local_260 = uStack_25c;
                  uStack_258 = uStack_25c;
                  uStack_254 = uStack_25c;
                  uStack_250 = (local_650.context)->instPrimID[0];
                  uStack_24c = uStack_250;
                  uStack_248 = uStack_250;
                  uStack_244 = uStack_250;
                  local_690 = local_450._0_8_;
                  uStack_688 = local_450._8_8_;
                  local_650.valid = (int *)&local_690;
                  local_650.geometryUserPtr = pGVar93->userPtr;
                  local_650.hit = (RTCHitN *)&local_2d0;
                  local_650.N = 4;
                  local_440 = (uint)uVar88;
                  uStack_43c = (uint)(uVar88 >> 0x20);
                  local_650.ray = (RTCRayN *)ray;
                  if (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar93->intersectionFilterN)(&local_650);
                    uVar88 = CONCAT44(uStack_43c,local_440);
                    auVar222 = ZEXT1664(local_480._0_16_);
                    auVar225 = ZEXT3264(local_5c0);
                    auVar224 = ZEXT3264(local_5a0);
                    auVar219 = ZEXT3264(local_600);
                    auVar220 = ZEXT3264(local_4c0);
                    auVar221 = ZEXT3264(local_4a0);
                    in_ZMM21 = ZEXT3264(local_580);
                    in_ZMM20 = ZEXT3264(local_560);
                    auVar102 = vxorps_avx512vl(auVar100,auVar100);
                    auVar223 = ZEXT1664(auVar102);
                    uVar92 = local_4e0._0_4_;
                  }
                  auVar102 = auVar223._0_16_;
                  auVar77._8_8_ = uStack_688;
                  auVar77._0_8_ = local_690;
                  uVar91 = vptestmd_avx512vl(auVar77,auVar77);
                  if ((uVar91 & 0xf) == 0) {
LAB_01dc13da:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_500._0_4_;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar93->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_650);
                      uVar88 = CONCAT44(uStack_43c,local_440);
                      auVar222 = ZEXT1664(local_480._0_16_);
                      auVar225 = ZEXT3264(local_5c0);
                      auVar224 = ZEXT3264(local_5a0);
                      auVar219 = ZEXT3264(local_600);
                      auVar220 = ZEXT3264(local_4c0);
                      auVar221 = ZEXT3264(local_4a0);
                      in_ZMM21 = ZEXT3264(local_580);
                      in_ZMM20 = ZEXT3264(local_560);
                      auVar102 = vxorps_avx512vl(auVar102,auVar102);
                      auVar223 = ZEXT1664(auVar102);
                      uVar92 = local_4e0._0_4_;
                    }
                    auVar78._8_8_ = uStack_688;
                    auVar78._0_8_ = local_690;
                    uVar91 = vptestmd_avx512vl(auVar78,auVar78);
                    uVar91 = uVar91 & 0xf;
                    bVar87 = (byte)uVar91;
                    if (bVar87 == 0) goto LAB_01dc13da;
                    iVar1 = *(int *)(local_650.hit + 4);
                    iVar2 = *(int *)(local_650.hit + 8);
                    iVar74 = *(int *)(local_650.hit + 0xc);
                    bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar18 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_650.ray + 0xc0) =
                         (uint)(bVar87 & 1) * *(int *)local_650.hit |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xc0);
                    *(uint *)(local_650.ray + 0xc4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xc4);
                    *(uint *)(local_650.ray + 200) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 200);
                    *(uint *)(local_650.ray + 0xcc) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xcc);
                    iVar1 = *(int *)(local_650.hit + 0x14);
                    iVar2 = *(int *)(local_650.hit + 0x18);
                    iVar74 = *(int *)(local_650.hit + 0x1c);
                    bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar18 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_650.ray + 0xd0) =
                         (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x10) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xd0);
                    *(uint *)(local_650.ray + 0xd4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xd4);
                    *(uint *)(local_650.ray + 0xd8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 0xd8);
                    *(uint *)(local_650.ray + 0xdc) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xdc);
                    iVar1 = *(int *)(local_650.hit + 0x24);
                    iVar2 = *(int *)(local_650.hit + 0x28);
                    iVar74 = *(int *)(local_650.hit + 0x2c);
                    bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar18 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_650.ray + 0xe0) =
                         (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x20) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xe0);
                    *(uint *)(local_650.ray + 0xe4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xe4);
                    *(uint *)(local_650.ray + 0xe8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 0xe8);
                    *(uint *)(local_650.ray + 0xec) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xec);
                    iVar1 = *(int *)(local_650.hit + 0x34);
                    iVar2 = *(int *)(local_650.hit + 0x38);
                    iVar74 = *(int *)(local_650.hit + 0x3c);
                    bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar18 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_650.ray + 0xf0) =
                         (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x30) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xf0);
                    *(uint *)(local_650.ray + 0xf4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xf4);
                    *(uint *)(local_650.ray + 0xf8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 0xf8);
                    *(uint *)(local_650.ray + 0xfc) =
                         (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xfc);
                    auVar102 = *(undefined1 (*) [16])(local_650.ray + 0x100);
                    auVar106._0_4_ =
                         (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x40) |
                         (uint)!(bool)(bVar87 & 1) * auVar102._0_4_;
                    bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                    auVar106._4_4_ =
                         (uint)bVar16 * *(int *)(local_650.hit + 0x44) |
                         (uint)!bVar16 * auVar102._4_4_;
                    bVar16 = (bool)((byte)(uVar91 >> 2) & 1);
                    auVar106._8_4_ =
                         (uint)bVar16 * *(int *)(local_650.hit + 0x48) |
                         (uint)!bVar16 * auVar102._8_4_;
                    bVar16 = SUB81(uVar91 >> 3,0);
                    auVar106._12_4_ =
                         (uint)bVar16 * *(int *)(local_650.hit + 0x4c) |
                         (uint)!bVar16 * auVar102._12_4_;
                    *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar106;
                    auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x50));
                    *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar102;
                    auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x60));
                    *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar102;
                    auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x70));
                    *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar102;
                    auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x80));
                    *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar102;
                  }
                  auVar205 = ZEXT3264(auVar125);
                  auVar188 = ZEXT3264(auVar110);
                  auVar102 = auVar222._0_16_;
                  bVar87 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & bVar97;
                  uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar37._4_4_ = uVar159;
                  auVar37._0_4_ = uVar159;
                  auVar37._8_4_ = uVar159;
                  auVar37._12_4_ = uVar159;
                  auVar37._16_4_ = uVar159;
                  auVar37._20_4_ = uVar159;
                  auVar37._24_4_ = uVar159;
                  auVar37._28_4_ = uVar159;
                  uVar171 = vcmpps_avx512vl(auVar110,auVar37,2);
                  bVar97 = bVar87 & (byte)uVar171;
                  if ((bVar87 & (byte)uVar171) != 0) {
                    auVar170._8_4_ = 0x7f800000;
                    auVar170._0_8_ = 0x7f8000007f800000;
                    auVar170._12_4_ = 0x7f800000;
                    auVar170._16_4_ = 0x7f800000;
                    auVar170._20_4_ = 0x7f800000;
                    auVar170._24_4_ = 0x7f800000;
                    auVar170._28_4_ = 0x7f800000;
                    auVar112 = vblendmps_avx512vl(auVar170,auVar110);
                    auVar149._0_4_ =
                         (uint)(bVar97 & 1) * auVar112._0_4_ |
                         (uint)!(bool)(bVar97 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar97 >> 1 & 1);
                    auVar149._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar97 >> 2 & 1);
                    auVar149._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar97 >> 3 & 1);
                    auVar149._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar97 >> 4 & 1);
                    auVar149._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar97 >> 5 & 1);
                    auVar149._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar97 >> 6 & 1);
                    auVar149._24_4_ = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar149._28_4_ =
                         (uint)(bVar97 >> 7) * auVar112._28_4_ |
                         (uint)!(bool)(bVar97 >> 7) * 0x7f800000;
                    auVar112 = vshufps_avx(auVar149,auVar149,0xb1);
                    auVar112 = vminps_avx(auVar149,auVar112);
                    auVar126 = vshufpd_avx(auVar112,auVar112,5);
                    auVar112 = vminps_avx(auVar112,auVar126);
                    auVar126 = vpermpd_avx2(auVar112,0x4e);
                    auVar112 = vminps_avx(auVar112,auVar126);
                    uVar171 = vcmpps_avx512vl(auVar149,auVar112,0);
                    bVar86 = (byte)uVar171 & bVar97;
                    bVar87 = bVar97;
                    if (bVar86 != 0) {
                      bVar87 = bVar86;
                    }
                    uVar90 = 0;
                    for (uVar89 = (uint)bVar87; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000
                        ) {
                      uVar90 = uVar90 + 1;
                    }
                    uVar88 = (ulong)uVar90;
                  }
                } while (bVar97 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar13) {
        local_480 = vpbroadcastd_avx512vl();
        local_4e0 = vbroadcastss_avx512vl(auVar102);
        fStack_410 = 1.0 / local_420;
        auStack_41c._0_4_ = fStack_410;
        local_420 = fStack_410;
        auStack_41c._4_4_ = fStack_410;
        fStack_414 = fStack_410;
        local_500 = vpbroadcastd_avx512vl();
        local_510 = vpbroadcastd_avx512vl();
        lVar96 = 8;
        auVar110 = auVar205._0_32_;
        auVar112 = auVar188._0_32_;
        local_440 = uVar92;
        uStack_43c = uVar92;
        uStack_438 = uVar92;
        uStack_434 = uVar92;
        uStack_430 = uVar92;
        uStack_42c = uVar92;
        uStack_428 = uVar92;
        uStack_424 = uVar92;
        fStack_40c = fStack_410;
        fStack_408 = fStack_410;
        fStack_404 = fStack_410;
        do {
          auVar125 = vpbroadcastd_avx512vl();
          auVar113 = vpor_avx2(auVar125,_DAT_0205a920);
          uVar25 = vpcmpd_avx512vl(auVar113,local_480,1);
          auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar96 * 4 + lVar26);
          auVar126 = *(undefined1 (*) [32])(lVar26 + 0x22307f0 + lVar96 * 4);
          auVar124 = *(undefined1 (*) [32])(lVar26 + 0x2230c74 + lVar96 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar26 + 0x22310f8 + lVar96 * 4);
          local_5a0 = auVar224._0_32_;
          auVar114 = vmulps_avx512vl(local_5a0,auVar111);
          local_5c0 = auVar225._0_32_;
          auVar115 = vmulps_avx512vl(local_5c0,auVar111);
          auVar55._4_4_ = auVar111._4_4_ * (float)local_140._4_4_;
          auVar55._0_4_ = auVar111._0_4_ * (float)local_140._0_4_;
          auVar55._8_4_ = auVar111._8_4_ * fStack_138;
          auVar55._12_4_ = auVar111._12_4_ * fStack_134;
          auVar55._16_4_ = auVar111._16_4_ * fStack_130;
          auVar55._20_4_ = auVar111._20_4_ * fStack_12c;
          auVar55._24_4_ = auVar111._24_4_ * fStack_128;
          auVar55._28_4_ = auVar113._28_4_;
          auVar113 = vfmadd231ps_avx512vl(auVar114,auVar124,local_e0);
          auVar114 = vfmadd231ps_avx512vl(auVar115,auVar124,local_100);
          auVar115 = vfmadd231ps_avx512vl(auVar55,auVar124,local_120);
          auVar122 = auVar219._0_32_;
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar126,auVar122);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar126,local_1e0);
          auVar102 = vfmadd231ps_fma(auVar115,auVar126,local_c0);
          auVar207 = auVar221._0_32_;
          auVar117 = vfmadd231ps_avx512vl(auVar113,auVar125,auVar207);
          auVar204 = auVar220._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar114,auVar125,auVar204);
          auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar96 * 4 + lVar26);
          auVar114 = *(undefined1 (*) [32])(lVar26 + 0x2232c10 + lVar96 * 4);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar125,local_a0);
          auVar115 = *(undefined1 (*) [32])(lVar26 + 0x2233094 + lVar96 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar26 + 0x2233518 + lVar96 * 4);
          auVar109 = vmulps_avx512vl(local_5a0,auVar123);
          auVar116 = vmulps_avx512vl(local_5c0,auVar123);
          auVar56._4_4_ = auVar123._4_4_ * (float)local_140._4_4_;
          auVar56._0_4_ = auVar123._0_4_ * (float)local_140._0_4_;
          auVar56._8_4_ = auVar123._8_4_ * fStack_138;
          auVar56._12_4_ = auVar123._12_4_ * fStack_134;
          auVar56._16_4_ = auVar123._16_4_ * fStack_130;
          auVar56._20_4_ = auVar123._20_4_ * fStack_12c;
          auVar56._24_4_ = auVar123._24_4_ * fStack_128;
          auVar56._28_4_ = uStack_124;
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar115,local_e0);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,local_100);
          auVar108 = vfmadd231ps_avx512vl(auVar56,auVar115,local_120);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar114,auVar122);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar114,local_1e0);
          auVar101 = vfmadd231ps_fma(auVar108,auVar114,local_c0);
          auVar108 = vfmadd231ps_avx512vl(auVar109,auVar113,auVar207);
          auVar118 = vfmadd231ps_avx512vl(auVar116,auVar113,auVar204);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar113,local_a0);
          auVar119 = vmaxps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar101));
          auVar109 = vsubps_avx(auVar108,auVar117);
          auVar116 = vsubps_avx(auVar118,auVar107);
          auVar120 = vmulps_avx512vl(auVar107,auVar109);
          auVar121 = vmulps_avx512vl(auVar117,auVar116);
          auVar120 = vsubps_avx512vl(auVar120,auVar121);
          auVar121 = vmulps_avx512vl(auVar116,auVar116);
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar109,auVar109);
          auVar119 = vmulps_avx512vl(auVar119,auVar119);
          auVar119 = vmulps_avx512vl(auVar119,auVar121);
          auVar120 = vmulps_avx512vl(auVar120,auVar120);
          uVar171 = vcmpps_avx512vl(auVar120,auVar119,2);
          local_350 = (byte)uVar25 & (byte)uVar171;
          if (local_350 == 0) {
            auVar222 = ZEXT3264(auVar204);
            auVar219 = ZEXT3264(auVar122);
          }
          else {
            auVar123 = vmulps_avx512vl(local_1c0,auVar123);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_1a0,auVar123);
            auVar114 = vfmadd213ps_avx512vl(auVar114,local_180,auVar115);
            auVar113 = vfmadd213ps_avx512vl(auVar113,local_160,auVar114);
            auVar111 = vmulps_avx512vl(local_1c0,auVar111);
            auVar124 = vfmadd213ps_avx512vl(auVar124,local_1a0,auVar111);
            auVar126 = vfmadd213ps_avx512vl(auVar126,local_180,auVar124);
            auVar114 = vfmadd213ps_avx512vl(auVar125,local_160,auVar126);
            auVar125 = *(undefined1 (*) [32])(lVar26 + 0x223157c + lVar96 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar26 + 0x2231a00 + lVar96 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar26 + 0x2231e84 + lVar96 * 4);
            auVar111 = *(undefined1 (*) [32])(lVar26 + 0x2232308 + lVar96 * 4);
            auVar115 = vmulps_avx512vl(local_5a0,auVar111);
            auVar123 = vmulps_avx512vl(local_5c0,auVar111);
            auVar111 = vmulps_avx512vl(local_1c0,auVar111);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar124,local_e0);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar124,local_100);
            auVar124 = vfmadd231ps_avx512vl(auVar111,local_1a0,auVar124);
            auVar111 = vfmadd231ps_avx512vl(auVar115,auVar126,auVar122);
            auVar115 = vfmadd231ps_avx512vl(auVar123,auVar126,local_1e0);
            auVar126 = vfmadd231ps_avx512vl(auVar124,local_180,auVar126);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar125,auVar207);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,auVar204);
            auVar123 = vfmadd231ps_avx512vl(auVar126,local_160,auVar125);
            auVar125 = *(undefined1 (*) [32])(lVar26 + 0x223399c + lVar96 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar26 + 0x22342a4 + lVar96 * 4);
            auVar124 = *(undefined1 (*) [32])(lVar26 + 0x2234728 + lVar96 * 4);
            auVar119 = vmulps_avx512vl(local_5a0,auVar124);
            auVar120 = vmulps_avx512vl(local_5c0,auVar124);
            auVar124 = vmulps_avx512vl(local_1c0,auVar124);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar126,local_e0);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar126,local_100);
            auVar124 = vfmadd231ps_avx512vl(auVar124,local_1a0,auVar126);
            auVar126 = *(undefined1 (*) [32])(lVar26 + 0x2233e20 + lVar96 * 4);
            auVar119 = vfmadd231ps_avx512vl(auVar119,auVar126,auVar122);
            auVar161 = vfmadd231ps_fma(auVar120,auVar126,local_1e0);
            auVar126 = vfmadd231ps_avx512vl(auVar124,local_180,auVar126);
            auVar124 = vfmadd231ps_avx512vl(auVar119,auVar125,auVar207);
            auVar119 = vfmadd231ps_avx512vl(ZEXT1632(auVar161),auVar125,auVar204);
            auVar126 = vfmadd231ps_avx512vl(auVar126,local_160,auVar125);
            auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar111,auVar120);
            vandps_avx512vl(auVar115,auVar120);
            auVar125 = vmaxps_avx(auVar120,auVar120);
            vandps_avx512vl(auVar123,auVar120);
            auVar125 = vmaxps_avx(auVar125,auVar120);
            uVar88 = vcmpps_avx512vl(auVar125,local_4e0,1);
            bVar16 = (bool)((byte)uVar88 & 1);
            auVar138._0_4_ = (float)((uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar111._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar138._4_4_ = (float)((uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar111._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar138._8_4_ = (float)((uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar111._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar138._12_4_ =
                 (float)((uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar111._12_4_);
            bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar138._16_4_ =
                 (float)((uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar111._16_4_);
            bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar138._20_4_ =
                 (float)((uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar111._20_4_);
            bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar138._24_4_ =
                 (float)((uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar111._24_4_);
            bVar16 = SUB81(uVar88 >> 7,0);
            auVar138._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar111._28_4_;
            bVar16 = (bool)((byte)uVar88 & 1);
            auVar139._0_4_ = (float)((uint)bVar16 * auVar116._0_4_ | (uint)!bVar16 * auVar115._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar115._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar115._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar115._12_4_);
            bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar16 * auVar116._16_4_ | (uint)!bVar16 * auVar115._16_4_);
            bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar16 * auVar116._20_4_ | (uint)!bVar16 * auVar115._20_4_);
            bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar16 * auVar116._24_4_ | (uint)!bVar16 * auVar115._24_4_);
            bVar16 = SUB81(uVar88 >> 7,0);
            auVar139._28_4_ = (uint)bVar16 * auVar116._28_4_ | (uint)!bVar16 * auVar115._28_4_;
            vandps_avx512vl(auVar124,auVar120);
            vandps_avx512vl(auVar119,auVar120);
            auVar125 = vmaxps_avx(auVar139,auVar139);
            vandps_avx512vl(auVar126,auVar120);
            auVar125 = vmaxps_avx(auVar125,auVar139);
            uVar88 = vcmpps_avx512vl(auVar125,local_4e0,1);
            bVar16 = (bool)((byte)uVar88 & 1);
            auVar140._0_4_ = (uint)bVar16 * auVar109._0_4_ | (uint)!bVar16 * auVar124._0_4_;
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar140._4_4_ = (uint)bVar16 * auVar109._4_4_ | (uint)!bVar16 * auVar124._4_4_;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar140._8_4_ = (uint)bVar16 * auVar109._8_4_ | (uint)!bVar16 * auVar124._8_4_;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar140._12_4_ = (uint)bVar16 * auVar109._12_4_ | (uint)!bVar16 * auVar124._12_4_;
            bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar140._16_4_ = (uint)bVar16 * auVar109._16_4_ | (uint)!bVar16 * auVar124._16_4_;
            bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar140._20_4_ = (uint)bVar16 * auVar109._20_4_ | (uint)!bVar16 * auVar124._20_4_;
            bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar140._24_4_ = (uint)bVar16 * auVar109._24_4_ | (uint)!bVar16 * auVar124._24_4_;
            bVar16 = SUB81(uVar88 >> 7,0);
            auVar140._28_4_ = (uint)bVar16 * auVar109._28_4_ | (uint)!bVar16 * auVar124._28_4_;
            bVar16 = (bool)((byte)uVar88 & 1);
            auVar141._0_4_ = (float)((uint)bVar16 * auVar116._0_4_ | (uint)!bVar16 * auVar119._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar141._4_4_ = (float)((uint)bVar16 * auVar116._4_4_ | (uint)!bVar16 * auVar119._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar141._8_4_ = (float)((uint)bVar16 * auVar116._8_4_ | (uint)!bVar16 * auVar119._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar141._12_4_ =
                 (float)((uint)bVar16 * auVar116._12_4_ | (uint)!bVar16 * auVar119._12_4_);
            bVar16 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar141._16_4_ =
                 (float)((uint)bVar16 * auVar116._16_4_ | (uint)!bVar16 * auVar119._16_4_);
            bVar16 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar141._20_4_ =
                 (float)((uint)bVar16 * auVar116._20_4_ | (uint)!bVar16 * auVar119._20_4_);
            bVar16 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar141._24_4_ =
                 (float)((uint)bVar16 * auVar116._24_4_ | (uint)!bVar16 * auVar119._24_4_);
            bVar16 = SUB81(uVar88 >> 7,0);
            auVar141._28_4_ = (uint)bVar16 * auVar116._28_4_ | (uint)!bVar16 * auVar119._28_4_;
            auVar210._8_4_ = 0x80000000;
            auVar210._0_8_ = 0x8000000080000000;
            auVar210._12_4_ = 0x80000000;
            auVar210._16_4_ = 0x80000000;
            auVar210._20_4_ = 0x80000000;
            auVar210._24_4_ = 0x80000000;
            auVar210._28_4_ = 0x80000000;
            auVar125 = vxorps_avx512vl(auVar140,auVar210);
            auVar119 = auVar223._0_32_;
            auVar126 = vfmadd213ps_avx512vl(auVar138,auVar138,auVar119);
            auVar161 = vfmadd231ps_fma(auVar126,auVar139,auVar139);
            auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar161));
            auVar218._8_4_ = 0xbf000000;
            auVar218._0_8_ = 0xbf000000bf000000;
            auVar218._12_4_ = 0xbf000000;
            auVar218._16_4_ = 0xbf000000;
            auVar218._20_4_ = 0xbf000000;
            auVar218._24_4_ = 0xbf000000;
            auVar218._28_4_ = 0xbf000000;
            fVar190 = auVar126._0_4_;
            fVar158 = auVar126._4_4_;
            fVar196 = auVar126._8_4_;
            fVar197 = auVar126._12_4_;
            fVar175 = auVar126._16_4_;
            fVar189 = auVar126._20_4_;
            fVar98 = auVar126._24_4_;
            auVar57._4_4_ = fVar158 * fVar158 * fVar158 * auVar161._4_4_ * -0.5;
            auVar57._0_4_ = fVar190 * fVar190 * fVar190 * auVar161._0_4_ * -0.5;
            auVar57._8_4_ = fVar196 * fVar196 * fVar196 * auVar161._8_4_ * -0.5;
            auVar57._12_4_ = fVar197 * fVar197 * fVar197 * auVar161._12_4_ * -0.5;
            auVar57._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar57._20_4_ = fVar189 * fVar189 * fVar189 * -0.0;
            auVar57._24_4_ = fVar98 * fVar98 * fVar98 * -0.0;
            auVar57._28_4_ = auVar139._28_4_;
            auVar124 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar126 = vfmadd231ps_avx512vl(auVar57,auVar124,auVar126);
            auVar58._4_4_ = auVar139._4_4_ * auVar126._4_4_;
            auVar58._0_4_ = auVar139._0_4_ * auVar126._0_4_;
            auVar58._8_4_ = auVar139._8_4_ * auVar126._8_4_;
            auVar58._12_4_ = auVar139._12_4_ * auVar126._12_4_;
            auVar58._16_4_ = auVar139._16_4_ * auVar126._16_4_;
            auVar58._20_4_ = auVar139._20_4_ * auVar126._20_4_;
            auVar58._24_4_ = auVar139._24_4_ * auVar126._24_4_;
            auVar58._28_4_ = 0;
            auVar59._4_4_ = auVar126._4_4_ * -auVar138._4_4_;
            auVar59._0_4_ = auVar126._0_4_ * -auVar138._0_4_;
            auVar59._8_4_ = auVar126._8_4_ * -auVar138._8_4_;
            auVar59._12_4_ = auVar126._12_4_ * -auVar138._12_4_;
            auVar59._16_4_ = auVar126._16_4_ * -auVar138._16_4_;
            auVar59._20_4_ = auVar126._20_4_ * -auVar138._20_4_;
            auVar59._24_4_ = auVar126._24_4_ * -auVar138._24_4_;
            auVar59._28_4_ = auVar139._28_4_;
            auVar111 = vmulps_avx512vl(auVar126,auVar119);
            auVar126 = vfmadd213ps_avx512vl(auVar140,auVar140,auVar119);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar141,auVar141);
            auVar115 = vrsqrt14ps_avx512vl(auVar126);
            auVar126 = vmulps_avx512vl(auVar126,auVar218);
            fVar190 = auVar115._0_4_;
            fVar158 = auVar115._4_4_;
            fVar196 = auVar115._8_4_;
            fVar197 = auVar115._12_4_;
            fVar175 = auVar115._16_4_;
            fVar189 = auVar115._20_4_;
            fVar98 = auVar115._24_4_;
            auVar60._4_4_ = fVar158 * fVar158 * fVar158 * auVar126._4_4_;
            auVar60._0_4_ = fVar190 * fVar190 * fVar190 * auVar126._0_4_;
            auVar60._8_4_ = fVar196 * fVar196 * fVar196 * auVar126._8_4_;
            auVar60._12_4_ = fVar197 * fVar197 * fVar197 * auVar126._12_4_;
            auVar60._16_4_ = fVar175 * fVar175 * fVar175 * auVar126._16_4_;
            auVar60._20_4_ = fVar189 * fVar189 * fVar189 * auVar126._20_4_;
            auVar60._24_4_ = fVar98 * fVar98 * fVar98 * auVar126._24_4_;
            auVar60._28_4_ = auVar126._28_4_;
            auVar126 = vfmadd231ps_avx512vl(auVar60,auVar124,auVar115);
            auVar61._4_4_ = auVar141._4_4_ * auVar126._4_4_;
            auVar61._0_4_ = auVar141._0_4_ * auVar126._0_4_;
            auVar61._8_4_ = auVar141._8_4_ * auVar126._8_4_;
            auVar61._12_4_ = auVar141._12_4_ * auVar126._12_4_;
            auVar61._16_4_ = auVar141._16_4_ * auVar126._16_4_;
            auVar61._20_4_ = auVar141._20_4_ * auVar126._20_4_;
            auVar61._24_4_ = auVar141._24_4_ * auVar126._24_4_;
            auVar61._28_4_ = auVar115._28_4_;
            auVar62._4_4_ = auVar126._4_4_ * auVar125._4_4_;
            auVar62._0_4_ = auVar126._0_4_ * auVar125._0_4_;
            auVar62._8_4_ = auVar126._8_4_ * auVar125._8_4_;
            auVar62._12_4_ = auVar126._12_4_ * auVar125._12_4_;
            auVar62._16_4_ = auVar126._16_4_ * auVar125._16_4_;
            auVar62._20_4_ = auVar126._20_4_ * auVar125._20_4_;
            auVar62._24_4_ = auVar126._24_4_ * auVar125._24_4_;
            auVar62._28_4_ = auVar125._28_4_;
            auVar125 = vmulps_avx512vl(auVar126,auVar119);
            auVar161 = vfmadd213ps_fma(auVar58,ZEXT1632(auVar102),auVar117);
            auVar126 = ZEXT1632(auVar102);
            auVar160 = vfmadd213ps_fma(auVar59,auVar126,auVar107);
            auVar124 = vfmadd213ps_avx512vl(auVar111,auVar126,auVar114);
            auVar115 = vfmadd213ps_avx512vl(auVar61,ZEXT1632(auVar101),auVar108);
            auVar24 = vfnmadd213ps_fma(auVar58,auVar126,auVar117);
            auVar123 = ZEXT1632(auVar101);
            auVar100 = vfmadd213ps_fma(auVar62,auVar123,auVar118);
            auVar103 = vfnmadd213ps_fma(auVar59,auVar126,auVar107);
            auVar8 = vfmadd213ps_fma(auVar125,auVar123,auVar113);
            auVar107 = ZEXT1632(auVar102);
            auVar206 = vfnmadd231ps_fma(auVar114,auVar107,auVar111);
            auVar176 = vfnmadd213ps_fma(auVar61,auVar123,auVar108);
            auVar177 = vfnmadd213ps_fma(auVar62,auVar123,auVar118);
            auVar104 = vfnmadd231ps_fma(auVar113,ZEXT1632(auVar101),auVar125);
            auVar113 = vsubps_avx512vl(auVar115,ZEXT1632(auVar24));
            auVar125 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar103));
            auVar126 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar206));
            auVar63._4_4_ = auVar125._4_4_ * auVar206._4_4_;
            auVar63._0_4_ = auVar125._0_4_ * auVar206._0_4_;
            auVar63._8_4_ = auVar125._8_4_ * auVar206._8_4_;
            auVar63._12_4_ = auVar125._12_4_ * auVar206._12_4_;
            auVar63._16_4_ = auVar125._16_4_ * 0.0;
            auVar63._20_4_ = auVar125._20_4_ * 0.0;
            auVar63._24_4_ = auVar125._24_4_ * 0.0;
            auVar63._28_4_ = auVar111._28_4_;
            auVar102 = vfmsub231ps_fma(auVar63,ZEXT1632(auVar103),auVar126);
            auVar64._4_4_ = auVar126._4_4_ * auVar24._4_4_;
            auVar64._0_4_ = auVar126._0_4_ * auVar24._0_4_;
            auVar64._8_4_ = auVar126._8_4_ * auVar24._8_4_;
            auVar64._12_4_ = auVar126._12_4_ * auVar24._12_4_;
            auVar64._16_4_ = auVar126._16_4_ * 0.0;
            auVar64._20_4_ = auVar126._20_4_ * 0.0;
            auVar64._24_4_ = auVar126._24_4_ * 0.0;
            auVar64._28_4_ = auVar126._28_4_;
            auVar9 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar206),auVar113);
            auVar65._4_4_ = auVar103._4_4_ * auVar113._4_4_;
            auVar65._0_4_ = auVar103._0_4_ * auVar113._0_4_;
            auVar65._8_4_ = auVar103._8_4_ * auVar113._8_4_;
            auVar65._12_4_ = auVar103._12_4_ * auVar113._12_4_;
            auVar65._16_4_ = auVar113._16_4_ * 0.0;
            auVar65._20_4_ = auVar113._20_4_ * 0.0;
            auVar65._24_4_ = auVar113._24_4_ * 0.0;
            auVar65._28_4_ = auVar113._28_4_;
            auVar10 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar24),auVar125);
            auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar119,ZEXT1632(auVar9));
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar119,ZEXT1632(auVar102));
            uVar88 = vcmpps_avx512vl(auVar125,auVar119,2);
            bVar97 = (byte)uVar88;
            fVar150 = (float)((uint)(bVar97 & 1) * auVar161._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * auVar176._0_4_);
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar152 = (float)((uint)bVar16 * auVar161._4_4_ | (uint)!bVar16 * auVar176._4_4_);
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar155 = (float)((uint)bVar16 * auVar161._8_4_ | (uint)!bVar16 * auVar176._8_4_);
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar156 = (float)((uint)bVar16 * auVar161._12_4_ | (uint)!bVar16 * auVar176._12_4_);
            auVar123 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar155,CONCAT44(fVar152,fVar150))));
            fVar151 = (float)((uint)(bVar97 & 1) * auVar160._0_4_ |
                             (uint)!(bool)(bVar97 & 1) * auVar177._0_4_);
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar154 = (float)((uint)bVar16 * auVar160._4_4_ | (uint)!bVar16 * auVar177._4_4_);
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar153 = (float)((uint)bVar16 * auVar160._8_4_ | (uint)!bVar16 * auVar177._8_4_);
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar157 = (float)((uint)bVar16 * auVar160._12_4_ | (uint)!bVar16 * auVar177._12_4_);
            auVar109 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar153,CONCAT44(fVar154,fVar151))));
            auVar142._0_4_ =
                 (float)((uint)(bVar97 & 1) * auVar124._0_4_ |
                        (uint)!(bool)(bVar97 & 1) * auVar104._0_4_);
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar16 * auVar124._4_4_ | (uint)!bVar16 * auVar104._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar16 * auVar124._8_4_ | (uint)!bVar16 * auVar104._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar16 * auVar124._12_4_ | (uint)!bVar16 * auVar104._12_4_);
            fVar196 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar124._16_4_);
            auVar142._16_4_ = fVar196;
            fVar190 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar124._20_4_);
            auVar142._20_4_ = fVar190;
            fVar158 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar124._24_4_);
            auVar142._24_4_ = fVar158;
            iVar1 = (uint)(byte)(uVar88 >> 7) * auVar124._28_4_;
            auVar142._28_4_ = iVar1;
            auVar125 = vblendmps_avx512vl(ZEXT1632(auVar24),auVar115);
            auVar143._0_4_ =
                 (uint)(bVar97 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar97 & 1) * auVar102._0_4_;
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar143._4_4_ = (uint)bVar16 * auVar125._4_4_ | (uint)!bVar16 * auVar102._4_4_;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar143._8_4_ = (uint)bVar16 * auVar125._8_4_ | (uint)!bVar16 * auVar102._8_4_;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar143._12_4_ = (uint)bVar16 * auVar125._12_4_ | (uint)!bVar16 * auVar102._12_4_;
            auVar143._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_;
            auVar143._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_;
            auVar143._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_;
            auVar143._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
            auVar125 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar100));
            auVar144._0_4_ =
                 (float)((uint)(bVar97 & 1) * auVar125._0_4_ |
                        (uint)!(bool)(bVar97 & 1) * auVar161._0_4_);
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar144._4_4_ = (float)((uint)bVar16 * auVar125._4_4_ | (uint)!bVar16 * auVar161._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar144._8_4_ = (float)((uint)bVar16 * auVar125._8_4_ | (uint)!bVar16 * auVar161._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar144._12_4_ =
                 (float)((uint)bVar16 * auVar125._12_4_ | (uint)!bVar16 * auVar161._12_4_);
            fVar197 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
            auVar144._16_4_ = fVar197;
            fVar175 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
            auVar144._20_4_ = fVar175;
            fVar189 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
            auVar144._24_4_ = fVar189;
            auVar144._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
            auVar125 = vblendmps_avx512vl(ZEXT1632(auVar206),ZEXT1632(auVar8));
            auVar145._0_4_ =
                 (float)((uint)(bVar97 & 1) * auVar125._0_4_ |
                        (uint)!(bool)(bVar97 & 1) * auVar160._0_4_);
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar16 * auVar125._4_4_ | (uint)!bVar16 * auVar160._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar16 * auVar125._8_4_ | (uint)!bVar16 * auVar160._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar16 * auVar125._12_4_ | (uint)!bVar16 * auVar160._12_4_);
            fVar99 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
            auVar145._16_4_ = fVar99;
            fVar98 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
            auVar145._20_4_ = fVar98;
            fVar174 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
            auVar145._24_4_ = fVar174;
            iVar2 = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
            auVar145._28_4_ = iVar2;
            auVar146._0_4_ =
                 (uint)(bVar97 & 1) * (int)auVar24._0_4_ |
                 (uint)!(bool)(bVar97 & 1) * auVar115._0_4_;
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar146._4_4_ = (uint)bVar16 * (int)auVar24._4_4_ | (uint)!bVar16 * auVar115._4_4_;
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar146._8_4_ = (uint)bVar16 * (int)auVar24._8_4_ | (uint)!bVar16 * auVar115._8_4_;
            bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar146._12_4_ = (uint)bVar16 * (int)auVar24._12_4_ | (uint)!bVar16 * auVar115._12_4_;
            auVar146._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar115._16_4_;
            auVar146._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar115._20_4_;
            auVar146._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar115._24_4_;
            auVar146._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar115._28_4_;
            bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar88 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar115 = vsubps_avx512vl(auVar146,auVar123);
            auVar126 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar103._12_4_ |
                                                     (uint)!bVar20 * auVar100._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar103._8_4_ |
                                                              (uint)!bVar18 * auVar100._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar103._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar100._4_4_,
                                                                       (uint)(bVar97 & 1) *
                                                                       (int)auVar103._0_4_ |
                                                                       (uint)!(bool)(bVar97 & 1) *
                                                                       auVar100._0_4_)))),auVar109);
            auVar124 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar206._12_4_ |
                                                     (uint)!bVar21 * auVar8._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar206._8_4_ |
                                                              (uint)!bVar19 * auVar8._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar206._4_4_ |
                                                                       (uint)!bVar17 * auVar8._4_4_,
                                                                       (uint)(bVar97 & 1) *
                                                                       (int)auVar206._0_4_ |
                                                                       (uint)!(bool)(bVar97 & 1) *
                                                                       auVar8._0_4_)))),auVar142);
            auVar111 = vsubps_avx(auVar123,auVar143);
            auVar113 = vsubps_avx(auVar109,auVar144);
            auVar114 = vsubps_avx(auVar142,auVar145);
            auVar66._4_4_ = auVar124._4_4_ * fVar152;
            auVar66._0_4_ = auVar124._0_4_ * fVar150;
            auVar66._8_4_ = auVar124._8_4_ * fVar155;
            auVar66._12_4_ = auVar124._12_4_ * fVar156;
            auVar66._16_4_ = auVar124._16_4_ * 0.0;
            auVar66._20_4_ = auVar124._20_4_ * 0.0;
            auVar66._24_4_ = auVar124._24_4_ * 0.0;
            auVar66._28_4_ = 0;
            auVar102 = vfmsub231ps_fma(auVar66,auVar142,auVar115);
            auVar187._0_4_ = fVar151 * auVar115._0_4_;
            auVar187._4_4_ = fVar154 * auVar115._4_4_;
            auVar187._8_4_ = fVar153 * auVar115._8_4_;
            auVar187._12_4_ = fVar157 * auVar115._12_4_;
            auVar187._16_4_ = auVar115._16_4_ * 0.0;
            auVar187._20_4_ = auVar115._20_4_ * 0.0;
            auVar187._24_4_ = auVar115._24_4_ * 0.0;
            auVar187._28_4_ = 0;
            auVar161 = vfmsub231ps_fma(auVar187,auVar123,auVar126);
            auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar161),auVar119,ZEXT1632(auVar102));
            auVar194._0_4_ = auVar126._0_4_ * auVar142._0_4_;
            auVar194._4_4_ = auVar126._4_4_ * auVar142._4_4_;
            auVar194._8_4_ = auVar126._8_4_ * auVar142._8_4_;
            auVar194._12_4_ = auVar126._12_4_ * auVar142._12_4_;
            auVar194._16_4_ = auVar126._16_4_ * fVar196;
            auVar194._20_4_ = auVar126._20_4_ * fVar190;
            auVar194._24_4_ = auVar126._24_4_ * fVar158;
            auVar194._28_4_ = 0;
            auVar102 = vfmsub231ps_fma(auVar194,auVar109,auVar124);
            auVar116 = vfmadd231ps_avx512vl(auVar125,auVar119,ZEXT1632(auVar102));
            auVar125 = vmulps_avx512vl(auVar114,auVar143);
            auVar125 = vfmsub231ps_avx512vl(auVar125,auVar111,auVar145);
            auVar67._4_4_ = auVar113._4_4_ * auVar145._4_4_;
            auVar67._0_4_ = auVar113._0_4_ * auVar145._0_4_;
            auVar67._8_4_ = auVar113._8_4_ * auVar145._8_4_;
            auVar67._12_4_ = auVar113._12_4_ * auVar145._12_4_;
            auVar67._16_4_ = auVar113._16_4_ * fVar99;
            auVar67._20_4_ = auVar113._20_4_ * fVar98;
            auVar67._24_4_ = auVar113._24_4_ * fVar174;
            auVar67._28_4_ = iVar2;
            auVar102 = vfmsub231ps_fma(auVar67,auVar144,auVar114);
            auVar195._0_4_ = auVar144._0_4_ * auVar111._0_4_;
            auVar195._4_4_ = auVar144._4_4_ * auVar111._4_4_;
            auVar195._8_4_ = auVar144._8_4_ * auVar111._8_4_;
            auVar195._12_4_ = auVar144._12_4_ * auVar111._12_4_;
            auVar195._16_4_ = fVar197 * auVar111._16_4_;
            auVar195._20_4_ = fVar175 * auVar111._20_4_;
            auVar195._24_4_ = fVar189 * auVar111._24_4_;
            auVar195._28_4_ = 0;
            auVar161 = vfmsub231ps_fma(auVar195,auVar113,auVar143);
            auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar161),auVar119,auVar125);
            auVar117 = vfmadd231ps_avx512vl(auVar125,auVar119,ZEXT1632(auVar102));
            auVar125 = vmaxps_avx(auVar116,auVar117);
            uVar171 = vcmpps_avx512vl(auVar125,auVar119,2);
            local_350 = local_350 & (byte)uVar171;
            auVar222 = ZEXT3264(auVar204);
            if (local_350 == 0) {
LAB_01dc09fa:
              local_350 = 0;
            }
            else {
              auVar68._4_4_ = auVar114._4_4_ * auVar126._4_4_;
              auVar68._0_4_ = auVar114._0_4_ * auVar126._0_4_;
              auVar68._8_4_ = auVar114._8_4_ * auVar126._8_4_;
              auVar68._12_4_ = auVar114._12_4_ * auVar126._12_4_;
              auVar68._16_4_ = auVar114._16_4_ * auVar126._16_4_;
              auVar68._20_4_ = auVar114._20_4_ * auVar126._20_4_;
              auVar68._24_4_ = auVar114._24_4_ * auVar126._24_4_;
              auVar68._28_4_ = auVar125._28_4_;
              auVar160 = vfmsub231ps_fma(auVar68,auVar113,auVar124);
              auVar69._4_4_ = auVar124._4_4_ * auVar111._4_4_;
              auVar69._0_4_ = auVar124._0_4_ * auVar111._0_4_;
              auVar69._8_4_ = auVar124._8_4_ * auVar111._8_4_;
              auVar69._12_4_ = auVar124._12_4_ * auVar111._12_4_;
              auVar69._16_4_ = auVar124._16_4_ * auVar111._16_4_;
              auVar69._20_4_ = auVar124._20_4_ * auVar111._20_4_;
              auVar69._24_4_ = auVar124._24_4_ * auVar111._24_4_;
              auVar69._28_4_ = auVar124._28_4_;
              auVar161 = vfmsub231ps_fma(auVar69,auVar115,auVar114);
              auVar70._4_4_ = auVar113._4_4_ * auVar115._4_4_;
              auVar70._0_4_ = auVar113._0_4_ * auVar115._0_4_;
              auVar70._8_4_ = auVar113._8_4_ * auVar115._8_4_;
              auVar70._12_4_ = auVar113._12_4_ * auVar115._12_4_;
              auVar70._16_4_ = auVar113._16_4_ * auVar115._16_4_;
              auVar70._20_4_ = auVar113._20_4_ * auVar115._20_4_;
              auVar70._24_4_ = auVar113._24_4_ * auVar115._24_4_;
              auVar70._28_4_ = auVar113._28_4_;
              auVar100 = vfmsub231ps_fma(auVar70,auVar111,auVar126);
              auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar161),ZEXT1632(auVar100));
              auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar160),auVar119);
              auVar126 = vrcp14ps_avx512vl(auVar125);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = &DAT_3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar32._16_4_ = 0x3f800000;
              auVar32._20_4_ = 0x3f800000;
              auVar32._24_4_ = 0x3f800000;
              auVar32._28_4_ = 0x3f800000;
              auVar124 = vfnmadd213ps_avx512vl(auVar126,auVar125,auVar32);
              auVar102 = vfmadd132ps_fma(auVar124,auVar126,auVar126);
              auVar71._4_4_ = auVar100._4_4_ * auVar142._4_4_;
              auVar71._0_4_ = auVar100._0_4_ * auVar142._0_4_;
              auVar71._8_4_ = auVar100._8_4_ * auVar142._8_4_;
              auVar71._12_4_ = auVar100._12_4_ * auVar142._12_4_;
              auVar71._16_4_ = fVar196 * 0.0;
              auVar71._20_4_ = fVar190 * 0.0;
              auVar71._24_4_ = fVar158 * 0.0;
              auVar71._28_4_ = iVar1;
              auVar161 = vfmadd231ps_fma(auVar71,auVar109,ZEXT1632(auVar161));
              auVar161 = vfmadd231ps_fma(ZEXT1632(auVar161),auVar123,ZEXT1632(auVar160));
              fVar190 = auVar102._0_4_;
              fVar158 = auVar102._4_4_;
              fVar196 = auVar102._8_4_;
              fVar197 = auVar102._12_4_;
              auVar126 = ZEXT1632(CONCAT412(auVar161._12_4_ * fVar197,
                                            CONCAT48(auVar161._8_4_ * fVar196,
                                                     CONCAT44(auVar161._4_4_ * fVar158,
                                                              auVar161._0_4_ * fVar190))));
              auVar85._4_4_ = uStack_43c;
              auVar85._0_4_ = local_440;
              auVar85._8_4_ = uStack_438;
              auVar85._12_4_ = uStack_434;
              auVar85._16_4_ = uStack_430;
              auVar85._20_4_ = uStack_42c;
              auVar85._24_4_ = uStack_428;
              auVar85._28_4_ = uStack_424;
              uVar171 = vcmpps_avx512vl(auVar126,auVar85,0xd);
              uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar33._4_4_ = uVar159;
              auVar33._0_4_ = uVar159;
              auVar33._8_4_ = uVar159;
              auVar33._12_4_ = uVar159;
              auVar33._16_4_ = uVar159;
              auVar33._20_4_ = uVar159;
              auVar33._24_4_ = uVar159;
              auVar33._28_4_ = uVar159;
              uVar25 = vcmpps_avx512vl(auVar126,auVar33,2);
              local_350 = (byte)uVar171 & (byte)uVar25 & local_350;
              if (local_350 == 0) goto LAB_01dc09fa;
              uVar171 = vcmpps_avx512vl(auVar125,auVar119,4);
              if ((local_350 & (byte)uVar171) == 0) {
                local_350 = 0;
              }
              else {
                local_350 = local_350 & (byte)uVar171;
                fVar175 = auVar116._0_4_ * fVar190;
                fVar189 = auVar116._4_4_ * fVar158;
                auVar72._4_4_ = fVar189;
                auVar72._0_4_ = fVar175;
                fVar98 = auVar116._8_4_ * fVar196;
                auVar72._8_4_ = fVar98;
                fVar99 = auVar116._12_4_ * fVar197;
                auVar72._12_4_ = fVar99;
                fVar174 = auVar116._16_4_ * 0.0;
                auVar72._16_4_ = fVar174;
                fVar150 = auVar116._20_4_ * 0.0;
                auVar72._20_4_ = fVar150;
                fVar151 = auVar116._24_4_ * 0.0;
                auVar72._24_4_ = fVar151;
                auVar72._28_4_ = auVar116._28_4_;
                fVar190 = auVar117._0_4_ * fVar190;
                fVar158 = auVar117._4_4_ * fVar158;
                auVar73._4_4_ = fVar158;
                auVar73._0_4_ = fVar190;
                fVar196 = auVar117._8_4_ * fVar196;
                auVar73._8_4_ = fVar196;
                fVar197 = auVar117._12_4_ * fVar197;
                auVar73._12_4_ = fVar197;
                fVar152 = auVar117._16_4_ * 0.0;
                auVar73._16_4_ = fVar152;
                fVar154 = auVar117._20_4_ * 0.0;
                auVar73._20_4_ = fVar154;
                fVar155 = auVar117._24_4_ * 0.0;
                auVar73._24_4_ = fVar155;
                auVar73._28_4_ = auVar117._28_4_;
                auVar203._8_4_ = 0x3f800000;
                auVar203._0_8_ = &DAT_3f8000003f800000;
                auVar203._12_4_ = 0x3f800000;
                auVar203._16_4_ = 0x3f800000;
                auVar203._20_4_ = 0x3f800000;
                auVar203._24_4_ = 0x3f800000;
                auVar203._28_4_ = 0x3f800000;
                auVar125 = vsubps_avx512vl(auVar203,auVar72);
                bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar88 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar88 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar88 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar88 >> 6) & 1);
                bVar22 = SUB81(uVar88 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar22 * auVar116._28_4_ |
                                              (uint)!bVar22 * auVar125._28_4_,
                                              CONCAT424((uint)bVar21 * (int)fVar151 |
                                                        (uint)!bVar21 * auVar125._24_4_,
                                                        CONCAT420((uint)bVar20 * (int)fVar150 |
                                                                  (uint)!bVar20 * auVar125._20_4_,
                                                                  CONCAT416((uint)bVar19 *
                                                                            (int)fVar174 |
                                                                            (uint)!bVar19 *
                                                                            auVar125._16_4_,
                                                                            CONCAT412((uint)bVar18 *
                                                                                      (int)fVar99 |
                                                                                      (uint)!bVar18
                                                                                      * auVar125.
                                                  _12_4_,CONCAT48((uint)bVar17 * (int)fVar98 |
                                                                  (uint)!bVar17 * auVar125._8_4_,
                                                                  CONCAT44((uint)bVar16 *
                                                                           (int)fVar189 |
                                                                           (uint)!bVar16 *
                                                                           auVar125._4_4_,
                                                                           (uint)(bVar97 & 1) *
                                                                           (int)fVar175 |
                                                                           (uint)!(bool)(bVar97 & 1)
                                                                           * auVar125._0_4_))))))));
                auVar125 = vsubps_avx(auVar203,auVar73);
                bVar16 = (bool)((byte)(uVar88 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar88 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar88 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar88 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar88 >> 6) & 1);
                bVar22 = SUB81(uVar88 >> 7,0);
                local_240._4_4_ = (uint)bVar16 * (int)fVar158 | (uint)!bVar16 * auVar125._4_4_;
                local_240._0_4_ =
                     (uint)(bVar97 & 1) * (int)fVar190 | (uint)!(bool)(bVar97 & 1) * auVar125._0_4_;
                local_240._8_4_ = (uint)bVar17 * (int)fVar196 | (uint)!bVar17 * auVar125._8_4_;
                local_240._12_4_ = (uint)bVar18 * (int)fVar197 | (uint)!bVar18 * auVar125._12_4_;
                local_240._16_4_ = (uint)bVar19 * (int)fVar152 | (uint)!bVar19 * auVar125._16_4_;
                local_240._20_4_ = (uint)bVar20 * (int)fVar154 | (uint)!bVar20 * auVar125._20_4_;
                local_240._24_4_ = (uint)bVar21 * (int)fVar155 | (uint)!bVar21 * auVar125._24_4_;
                local_240._28_4_ = (uint)bVar22 * auVar117._28_4_ | (uint)!bVar22 * auVar125._28_4_;
                in_ZMM21 = ZEXT3264(auVar126);
              }
            }
            auVar219 = ZEXT3264(local_600);
            if (local_350 != 0) {
              auVar125 = vsubps_avx(ZEXT1632(auVar101),auVar107);
              local_560 = in_ZMM20._0_32_;
              auVar125 = vfmadd213ps_avx512vl(auVar125,local_560,auVar107);
              auVar166._0_4_ = auVar125._0_4_ + auVar125._0_4_;
              auVar166._4_4_ = auVar125._4_4_ + auVar125._4_4_;
              auVar166._8_4_ = auVar125._8_4_ + auVar125._8_4_;
              auVar166._12_4_ = auVar125._12_4_ + auVar125._12_4_;
              auVar166._16_4_ = auVar125._16_4_ + auVar125._16_4_;
              auVar166._20_4_ = auVar125._20_4_ + auVar125._20_4_;
              auVar166._24_4_ = auVar125._24_4_ + auVar125._24_4_;
              auVar166._28_4_ = auVar125._28_4_ + auVar125._28_4_;
              uVar159 = *(undefined4 *)((long)local_678->ray_space + k * 4 + -0x10);
              auVar34._4_4_ = uVar159;
              auVar34._0_4_ = uVar159;
              auVar34._8_4_ = uVar159;
              auVar34._12_4_ = uVar159;
              auVar34._16_4_ = uVar159;
              auVar34._20_4_ = uVar159;
              auVar34._24_4_ = uVar159;
              auVar34._28_4_ = uVar159;
              auVar125 = vmulps_avx512vl(auVar166,auVar34);
              local_580 = in_ZMM21._0_32_;
              uVar171 = vcmpps_avx512vl(local_580,auVar125,6);
              local_350 = local_350 & (byte)uVar171;
              uVar92 = (uint)local_350;
              if (local_350 != 0) {
                auVar167._8_4_ = 0xbf800000;
                auVar167._0_8_ = 0xbf800000bf800000;
                auVar167._12_4_ = 0xbf800000;
                auVar167._16_4_ = 0xbf800000;
                auVar167._20_4_ = 0xbf800000;
                auVar167._24_4_ = 0xbf800000;
                auVar167._28_4_ = 0xbf800000;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_3e0 = vfmadd132ps_avx512vl(local_240,auVar167,auVar35);
                local_240 = local_3e0;
                auVar125 = local_240;
                local_3a0 = (undefined4)lVar96;
                local_380 = local_660;
                uStack_378 = uStack_658;
                local_370 = local_670;
                uStack_368 = uStack_668;
                local_360 = CONCAT44(fStack_61c,local_620);
                uStack_358 = CONCAT44(fStack_614,fStack_618);
                pGVar93 = (context->scene->geometries).items[uVar94].ptr;
                local_240 = auVar125;
                if ((pGVar93->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar125 = vaddps_avx512vl(local_560,_DAT_02020f40);
                  auVar102 = vcvtsi2ss_avx512f(auVar220._0_16_,local_3a0);
                  fVar190 = auVar102._0_4_;
                  local_340[0] = (fVar190 + auVar125._0_4_) * local_420;
                  local_340[1] = (fVar190 + auVar125._4_4_) * (float)auStack_41c._0_4_;
                  local_340[2] = (fVar190 + auVar125._8_4_) * (float)auStack_41c._4_4_;
                  local_340[3] = (fVar190 + auVar125._12_4_) * fStack_414;
                  fStack_330 = (fVar190 + auVar125._16_4_) * fStack_410;
                  fStack_32c = (fVar190 + auVar125._20_4_) * fStack_40c;
                  fStack_328 = (fVar190 + auVar125._24_4_) * fStack_408;
                  fStack_324 = fVar190 + auVar125._28_4_;
                  local_240._0_8_ = local_3e0._0_8_;
                  local_240._8_8_ = local_3e0._8_8_;
                  local_240._16_8_ = local_3e0._16_8_;
                  local_240._24_8_ = local_3e0._24_8_;
                  local_320 = local_240._0_8_;
                  uStack_318 = local_240._8_8_;
                  uStack_310 = local_240._16_8_;
                  uStack_308 = local_240._24_8_;
                  local_300 = local_580;
                  auVar168._8_4_ = 0x7f800000;
                  auVar168._0_8_ = 0x7f8000007f800000;
                  auVar168._12_4_ = 0x7f800000;
                  auVar168._16_4_ = 0x7f800000;
                  auVar168._20_4_ = 0x7f800000;
                  auVar168._24_4_ = 0x7f800000;
                  auVar168._28_4_ = 0x7f800000;
                  auVar125 = vblendmps_avx512vl(auVar168,local_580);
                  auVar147._0_4_ =
                       (uint)(local_350 & 1) * auVar125._0_4_ |
                       (uint)!(bool)(local_350 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_350 >> 1 & 1);
                  auVar147._4_4_ = (uint)bVar16 * auVar125._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_350 >> 2 & 1);
                  auVar147._8_4_ = (uint)bVar16 * auVar125._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_350 >> 3 & 1);
                  auVar147._12_4_ = (uint)bVar16 * auVar125._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_350 >> 4 & 1);
                  auVar147._16_4_ = (uint)bVar16 * auVar125._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_350 >> 5 & 1);
                  auVar147._20_4_ = (uint)bVar16 * auVar125._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_350 >> 6 & 1);
                  auVar147._24_4_ = (uint)bVar16 * auVar125._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar147._28_4_ =
                       (uint)(local_350 >> 7) * auVar125._28_4_ |
                       (uint)!(bool)(local_350 >> 7) * 0x7f800000;
                  auVar125 = vshufps_avx(auVar147,auVar147,0xb1);
                  auVar125 = vminps_avx(auVar147,auVar125);
                  auVar126 = vshufpd_avx(auVar125,auVar125,5);
                  auVar125 = vminps_avx(auVar125,auVar126);
                  auVar126 = vpermpd_avx2(auVar125,0x4e);
                  auVar125 = vminps_avx(auVar125,auVar126);
                  uVar171 = vcmpps_avx512vl(auVar147,auVar125,0);
                  bVar87 = (byte)uVar171 & local_350;
                  bVar97 = local_350;
                  if (bVar87 != 0) {
                    bVar97 = bVar87;
                  }
                  uVar90 = 0;
                  for (uVar89 = (uint)bVar97; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000)
                  {
                    uVar90 = uVar90 + 1;
                  }
                  uVar88 = (ulong)uVar90;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar93->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar190 = local_340[uVar88];
                    uVar159 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                    fVar158 = 1.0 - fVar190;
                    auVar160 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar158 + fVar158))),
                                                ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                    auVar161 = ZEXT416((uint)fVar190);
                    auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                               ZEXT416(0xc0a00000));
                    auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                               ZEXT416((uint)(fVar190 + fVar190)),auVar102);
                    auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar161,
                                               ZEXT416(0x40000000));
                    auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                               ZEXT416((uint)(fVar158 + fVar158)),auVar102);
                    auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),auVar161,
                                               ZEXT416((uint)(fVar158 * -2.0)));
                    fVar158 = auVar160._0_4_ * 0.5;
                    fVar196 = auVar101._0_4_ * 0.5;
                    fVar197 = auVar102._0_4_ * 0.5;
                    fVar175 = auVar161._0_4_ * 0.5;
                    auVar180._0_4_ = fVar175 * local_620;
                    auVar180._4_4_ = fVar175 * fStack_61c;
                    auVar180._8_4_ = fVar175 * fStack_618;
                    auVar180._12_4_ = fVar175 * fStack_614;
                    auVar199._4_4_ = fVar197;
                    auVar199._0_4_ = fVar197;
                    auVar199._8_4_ = fVar197;
                    auVar199._12_4_ = fVar197;
                    auVar79._8_8_ = uStack_668;
                    auVar79._0_8_ = local_670;
                    auVar102 = vfmadd132ps_fma(auVar199,auVar180,auVar79);
                    auVar181._4_4_ = fVar196;
                    auVar181._0_4_ = fVar196;
                    auVar181._8_4_ = fVar196;
                    auVar181._12_4_ = fVar196;
                    auVar80._8_8_ = uStack_658;
                    auVar80._0_8_ = local_660;
                    auVar102 = vfmadd132ps_fma(auVar181,auVar102,auVar80);
                    auVar173._4_4_ = fVar158;
                    auVar173._0_4_ = fVar158;
                    auVar173._8_4_ = fVar158;
                    auVar173._12_4_ = fVar158;
                    auVar102 = vfmadd213ps_fma(auVar173,auVar23,auVar102);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar102._0_4_;
                    uVar14 = vextractps_avx(auVar102,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar14;
                    uVar14 = vextractps_avx(auVar102,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar14;
                    *(float *)(ray + k * 4 + 0xf0) = fVar190;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar159;
                    *(uint *)(ray + k * 4 + 0x110) = uVar12;
                    *(uint *)(ray + k * 4 + 0x120) = uVar94;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_530 = local_660;
                    uStack_528 = uStack_658;
                    local_540 = (float)local_670;
                    fStack_53c = (float)((ulong)local_670 >> 0x20);
                    fStack_538 = (float)uStack_668;
                    fStack_534 = (float)((ulong)uStack_668 >> 0x20);
                    local_1f0 = local_360;
                    uStack_1e8 = uStack_358;
                    local_608 = pGVar93;
                    local_400 = local_560;
                    local_3c0 = local_580;
                    local_39c = iVar13;
                    local_390 = auVar23;
                    do {
                      auVar100 = auVar223._0_16_;
                      local_520 = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar190 = local_340[uVar88];
                      local_2a0._4_4_ = fVar190;
                      local_2a0._0_4_ = fVar190;
                      local_2a0._8_4_ = fVar190;
                      local_2a0._12_4_ = fVar190;
                      local_290 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                      local_650.context = context->user;
                      fVar158 = 1.0 - fVar190;
                      auVar160 = vfnmadd231ss_fma(ZEXT416((uint)(fVar190 * (fVar158 + fVar158))),
                                                  ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                      auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_2a0,
                                                 ZEXT416(0xc0a00000));
                      auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190 * 3.0)),
                                                 ZEXT416((uint)(fVar190 + fVar190)),auVar102);
                      auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_2a0,
                                                 ZEXT416(0x40000000));
                      auVar102 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                                 ZEXT416((uint)(fVar158 + fVar158)),auVar102);
                      auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar190 * fVar190)),local_2a0,
                                                 ZEXT416((uint)(fVar158 * -2.0)));
                      fVar190 = auVar160._0_4_ * 0.5;
                      fVar158 = auVar101._0_4_ * 0.5;
                      fVar196 = auVar102._0_4_ * 0.5;
                      fVar197 = auVar161._0_4_ * 0.5;
                      auVar182._0_4_ = fVar197 * (float)local_1f0;
                      auVar182._4_4_ = fVar197 * local_1f0._4_4_;
                      auVar182._8_4_ = fVar197 * (float)uStack_1e8;
                      auVar182._12_4_ = fVar197 * uStack_1e8._4_4_;
                      auVar200._4_4_ = fVar196;
                      auVar200._0_4_ = fVar196;
                      auVar200._8_4_ = fVar196;
                      auVar200._12_4_ = fVar196;
                      auVar81._4_4_ = fStack_53c;
                      auVar81._0_4_ = local_540;
                      auVar81._8_4_ = fStack_538;
                      auVar81._12_4_ = fStack_534;
                      auVar102 = vfmadd132ps_fma(auVar200,auVar182,auVar81);
                      auVar183._4_4_ = fVar158;
                      auVar183._0_4_ = fVar158;
                      auVar183._8_4_ = fVar158;
                      auVar183._12_4_ = fVar158;
                      auVar82._8_8_ = uStack_528;
                      auVar82._0_8_ = local_530;
                      auVar102 = vfmadd132ps_fma(auVar183,auVar102,auVar82);
                      auVar162._4_4_ = fVar190;
                      auVar162._0_4_ = fVar190;
                      auVar162._8_4_ = fVar190;
                      auVar162._12_4_ = fVar190;
                      auVar102 = vfmadd213ps_fma(auVar162,auVar23,auVar102);
                      local_2d0 = auVar102._0_4_;
                      local_2c0 = vshufps_avx(auVar102,auVar102,0x55);
                      local_2b0 = vshufps_avx(auVar102,auVar102,0xaa);
                      iStack_2cc = local_2d0;
                      iStack_2c8 = local_2d0;
                      iStack_2c4 = local_2d0;
                      uStack_28c = local_290;
                      uStack_288 = local_290;
                      uStack_284 = local_290;
                      local_280 = local_510._0_8_;
                      uStack_278 = local_510._8_8_;
                      local_270 = local_500;
                      vpcmpeqd_avx2(ZEXT1632(local_500),ZEXT1632(local_500));
                      uStack_25c = (local_650.context)->instID[0];
                      local_260 = uStack_25c;
                      uStack_258 = uStack_25c;
                      uStack_254 = uStack_25c;
                      uStack_250 = (local_650.context)->instPrimID[0];
                      uStack_24c = uStack_250;
                      uStack_248 = uStack_250;
                      uStack_244 = uStack_250;
                      local_690 = local_450._0_8_;
                      uStack_688 = local_450._8_8_;
                      local_650.valid = (int *)&local_690;
                      local_650.geometryUserPtr = pGVar93->userPtr;
                      local_650.hit = (RTCHitN *)&local_2d0;
                      local_650.N = 4;
                      local_5d0._0_4_ = uVar92;
                      local_650.ray = (RTCRayN *)ray;
                      if (pGVar93->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar93->intersectionFilterN)(&local_650);
                        auVar225 = ZEXT3264(local_5c0);
                        auVar224 = ZEXT3264(local_5a0);
                        auVar219 = ZEXT3264(local_600);
                        auVar222 = ZEXT3264(local_4c0);
                        auVar221 = ZEXT3264(local_4a0);
                        in_ZMM21 = ZEXT3264(local_580);
                        in_ZMM20 = ZEXT3264(local_560);
                        auVar102 = vxorps_avx512vl(auVar100,auVar100);
                        auVar223 = ZEXT1664(auVar102);
                        pGVar93 = local_608;
                        uVar92 = local_5d0._0_4_;
                      }
                      bVar97 = (byte)uVar92;
                      auVar102 = auVar223._0_16_;
                      auVar75._8_8_ = uStack_688;
                      auVar75._0_8_ = local_690;
                      uVar91 = vptestmd_avx512vl(auVar75,auVar75);
                      if ((uVar91 & 0xf) == 0) {
LAB_01dc0e71:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_520;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar93->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_650);
                          bVar97 = local_5d0[0];
                          auVar225 = ZEXT3264(local_5c0);
                          auVar224 = ZEXT3264(local_5a0);
                          auVar219 = ZEXT3264(local_600);
                          auVar222 = ZEXT3264(local_4c0);
                          auVar221 = ZEXT3264(local_4a0);
                          in_ZMM21 = ZEXT3264(local_580);
                          in_ZMM20 = ZEXT3264(local_560);
                          auVar102 = vxorps_avx512vl(auVar102,auVar102);
                          auVar223 = ZEXT1664(auVar102);
                          pGVar93 = local_608;
                        }
                        auVar76._8_8_ = uStack_688;
                        auVar76._0_8_ = local_690;
                        uVar91 = vptestmd_avx512vl(auVar76,auVar76);
                        uVar91 = uVar91 & 0xf;
                        bVar87 = (byte)uVar91;
                        if (bVar87 == 0) goto LAB_01dc0e71;
                        iVar1 = *(int *)(local_650.hit + 4);
                        iVar2 = *(int *)(local_650.hit + 8);
                        iVar74 = *(int *)(local_650.hit + 0xc);
                        bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar18 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_650.ray + 0xc0) =
                             (uint)(bVar87 & 1) * *(int *)local_650.hit |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xc0);
                        *(uint *)(local_650.ray + 0xc4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xc4);
                        *(uint *)(local_650.ray + 200) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 200);
                        *(uint *)(local_650.ray + 0xcc) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xcc);
                        iVar1 = *(int *)(local_650.hit + 0x14);
                        iVar2 = *(int *)(local_650.hit + 0x18);
                        iVar74 = *(int *)(local_650.hit + 0x1c);
                        bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar18 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_650.ray + 0xd0) =
                             (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x10) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xd0);
                        *(uint *)(local_650.ray + 0xd4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xd4);
                        *(uint *)(local_650.ray + 0xd8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 0xd8);
                        *(uint *)(local_650.ray + 0xdc) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xdc);
                        iVar1 = *(int *)(local_650.hit + 0x24);
                        iVar2 = *(int *)(local_650.hit + 0x28);
                        iVar74 = *(int *)(local_650.hit + 0x2c);
                        bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar18 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_650.ray + 0xe0) =
                             (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x20) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xe0);
                        *(uint *)(local_650.ray + 0xe4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xe4);
                        *(uint *)(local_650.ray + 0xe8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 0xe8);
                        *(uint *)(local_650.ray + 0xec) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xec);
                        iVar1 = *(int *)(local_650.hit + 0x34);
                        iVar2 = *(int *)(local_650.hit + 0x38);
                        iVar74 = *(int *)(local_650.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar18 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_650.ray + 0xf0) =
                             (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x30) |
                             (uint)!(bool)(bVar87 & 1) * *(int *)(local_650.ray + 0xf0);
                        *(uint *)(local_650.ray + 0xf4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_650.ray + 0xf4);
                        *(uint *)(local_650.ray + 0xf8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_650.ray + 0xf8);
                        *(uint *)(local_650.ray + 0xfc) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_650.ray + 0xfc);
                        auVar102 = *(undefined1 (*) [16])(local_650.ray + 0x100);
                        auVar105._0_4_ =
                             (uint)(bVar87 & 1) * *(int *)(local_650.hit + 0x40) |
                             (uint)!(bool)(bVar87 & 1) * auVar102._0_4_;
                        bVar16 = (bool)((byte)(uVar91 >> 1) & 1);
                        auVar105._4_4_ =
                             (uint)bVar16 * *(int *)(local_650.hit + 0x44) |
                             (uint)!bVar16 * auVar102._4_4_;
                        bVar16 = (bool)((byte)(uVar91 >> 2) & 1);
                        auVar105._8_4_ =
                             (uint)bVar16 * *(int *)(local_650.hit + 0x48) |
                             (uint)!bVar16 * auVar102._8_4_;
                        bVar16 = SUB81(uVar91 >> 3,0);
                        auVar105._12_4_ =
                             (uint)bVar16 * *(int *)(local_650.hit + 0x4c) |
                             (uint)!bVar16 * auVar102._12_4_;
                        *(undefined1 (*) [16])(local_650.ray + 0x100) = auVar105;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x50));
                        *(undefined1 (*) [16])(local_650.ray + 0x110) = auVar102;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x60));
                        *(undefined1 (*) [16])(local_650.ray + 0x120) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x70));
                        *(undefined1 (*) [16])(local_650.ray + 0x130) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_650.hit + 0x80));
                        *(undefined1 (*) [16])(local_650.ray + 0x140) = auVar102;
                      }
                      bVar97 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & bVar97;
                      uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar36._4_4_ = uVar159;
                      auVar36._0_4_ = uVar159;
                      auVar36._8_4_ = uVar159;
                      auVar36._12_4_ = uVar159;
                      auVar36._16_4_ = uVar159;
                      auVar36._20_4_ = uVar159;
                      auVar36._24_4_ = uVar159;
                      auVar36._28_4_ = uVar159;
                      uVar171 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar36,2);
                      bVar87 = bVar97 & (byte)uVar171;
                      uVar92 = (uint)bVar87;
                      if ((bVar97 & (byte)uVar171) != 0) {
                        auVar169._8_4_ = 0x7f800000;
                        auVar169._0_8_ = 0x7f8000007f800000;
                        auVar169._12_4_ = 0x7f800000;
                        auVar169._16_4_ = 0x7f800000;
                        auVar169._20_4_ = 0x7f800000;
                        auVar169._24_4_ = 0x7f800000;
                        auVar169._28_4_ = 0x7f800000;
                        auVar125 = vblendmps_avx512vl(auVar169,in_ZMM21._0_32_);
                        auVar148._0_4_ =
                             (uint)(bVar87 & 1) * auVar125._0_4_ |
                             (uint)!(bool)(bVar87 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar87 >> 1 & 1);
                        auVar148._4_4_ = (uint)bVar16 * auVar125._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar87 >> 2 & 1);
                        auVar148._8_4_ = (uint)bVar16 * auVar125._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar87 >> 3 & 1);
                        auVar148._12_4_ =
                             (uint)bVar16 * auVar125._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar87 >> 4 & 1);
                        auVar148._16_4_ =
                             (uint)bVar16 * auVar125._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar87 >> 5 & 1);
                        auVar148._20_4_ =
                             (uint)bVar16 * auVar125._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar87 >> 6 & 1);
                        auVar148._24_4_ =
                             (uint)bVar16 * auVar125._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar148._28_4_ =
                             (uint)(bVar87 >> 7) * auVar125._28_4_ |
                             (uint)!(bool)(bVar87 >> 7) * 0x7f800000;
                        auVar125 = vshufps_avx(auVar148,auVar148,0xb1);
                        auVar125 = vminps_avx(auVar148,auVar125);
                        auVar126 = vshufpd_avx(auVar125,auVar125,5);
                        auVar125 = vminps_avx(auVar125,auVar126);
                        auVar126 = vpermpd_avx2(auVar125,0x4e);
                        auVar125 = vminps_avx(auVar125,auVar126);
                        uVar171 = vcmpps_avx512vl(auVar148,auVar125,0);
                        bVar97 = (byte)uVar171 & bVar87;
                        uVar90 = uVar92;
                        if (bVar97 != 0) {
                          uVar90 = (uint)bVar97;
                        }
                        uVar89 = 0;
                        for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                          uVar89 = uVar89 + 1;
                        }
                        uVar88 = (ulong)uVar89;
                      }
                    } while (bVar87 != 0);
                  }
                }
              }
            }
          }
          auVar205 = ZEXT3264(auVar110);
          auVar188 = ZEXT3264(auVar112);
          lVar96 = lVar96 + 8;
          auVar220 = auVar222;
        } while ((int)lVar96 < iVar13);
      }
      uVar159 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31._4_4_ = uVar159;
      auVar31._0_4_ = uVar159;
      auVar31._8_4_ = uVar159;
      auVar31._12_4_ = uVar159;
      auVar31._16_4_ = uVar159;
      auVar31._20_4_ = uVar159;
      auVar31._24_4_ = uVar159;
      auVar31._28_4_ = uVar159;
      uVar171 = vcmpps_avx512vl(local_80,auVar31,2);
      uVar94 = (uint)uVar95 & (uint)uVar171;
      uVar95 = (ulong)uVar94;
    } while (uVar94 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }